

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  uint uVar29;
  long lVar30;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar48 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar52 [16];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  int iVar102;
  float t1;
  float fVar103;
  undefined1 auVar104 [16];
  float fVar105;
  float fVar106;
  undefined4 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar118 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vfloat4 b0_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar168 [16];
  undefined1 auVar180 [32];
  vfloat4 a0_3;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  vfloat4 a0_2;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar210;
  float fVar211;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar234;
  float fVar235;
  vfloat4 a0_1;
  float fVar236;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  vfloat4 a0;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  int iVar256;
  undefined1 in_ZMM30 [64];
  undefined1 auVar257 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar258 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a1;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_420 [4];
  RTCFilterFunctionNArguments local_410;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  
  PVar4 = prim[1];
  uVar26 = (ulong)(byte)PVar4;
  fVar215 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar38 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar49 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar129 = fVar215 * auVar49._0_4_;
  fVar103 = fVar215 * auVar38._0_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar67 = vpmovsxbd_avx2(auVar36);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar65 = vpmovsxbd_avx2(auVar47);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar66 = vpmovsxbd_avx2(auVar46);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar81 = vpmovsxbd_avx2(auVar45);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar82 = vpmovsxbd_avx2(auVar44);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar26 + 6);
  auVar83 = vpmovsxbd_avx2(auVar43);
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar33 = (ulong)(uint)((int)(uVar26 * 9) * 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar73 = vpmovsxbd_avx2(auVar42);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar33 + uVar26 + 6);
  auVar76 = vpmovsxbd_avx2(auVar41);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74 = vcvtdq2ps_avx(auVar76);
  uVar31 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar63 = vpmovsxbd_avx2(auVar3);
  auVar75 = vcvtdq2ps_avx(auVar63);
  auVar138._4_4_ = fVar103;
  auVar138._0_4_ = fVar103;
  auVar138._8_4_ = fVar103;
  auVar138._12_4_ = fVar103;
  auVar138._16_4_ = fVar103;
  auVar138._20_4_ = fVar103;
  auVar138._24_4_ = fVar103;
  auVar138._28_4_ = fVar103;
  auVar248._8_4_ = 1;
  auVar248._0_8_ = 0x100000001;
  auVar248._12_4_ = 1;
  auVar248._16_4_ = 1;
  auVar248._20_4_ = 1;
  auVar248._24_4_ = 1;
  auVar248._28_4_ = 1;
  auVar77 = ZEXT1632(CONCAT412(fVar215 * auVar38._12_4_,
                               CONCAT48(fVar215 * auVar38._8_4_,
                                        CONCAT44(fVar215 * auVar38._4_4_,fVar103))));
  auVar64 = vpermps_avx2(auVar248,auVar77);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar62 = vpermps_avx512vl(auVar61,auVar77);
  fVar103 = auVar62._0_4_;
  fVar214 = auVar62._4_4_;
  auVar77._4_4_ = fVar214 * auVar66._4_4_;
  auVar77._0_4_ = fVar103 * auVar66._0_4_;
  fVar199 = auVar62._8_4_;
  auVar77._8_4_ = fVar199 * auVar66._8_4_;
  fVar210 = auVar62._12_4_;
  auVar77._12_4_ = fVar210 * auVar66._12_4_;
  fVar211 = auVar62._16_4_;
  auVar77._16_4_ = fVar211 * auVar66._16_4_;
  fVar105 = auVar62._20_4_;
  auVar77._20_4_ = fVar105 * auVar66._20_4_;
  fVar106 = auVar62._24_4_;
  auVar77._24_4_ = fVar106 * auVar66._24_4_;
  auVar77._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar83._4_4_ * fVar214;
  auVar76._0_4_ = auVar83._0_4_ * fVar103;
  auVar76._8_4_ = auVar83._8_4_ * fVar199;
  auVar76._12_4_ = auVar83._12_4_ * fVar210;
  auVar76._16_4_ = auVar83._16_4_ * fVar211;
  auVar76._20_4_ = auVar83._20_4_ * fVar105;
  auVar76._24_4_ = auVar83._24_4_ * fVar106;
  auVar76._28_4_ = auVar63._28_4_;
  auVar63._4_4_ = auVar75._4_4_ * fVar214;
  auVar63._0_4_ = auVar75._0_4_ * fVar103;
  auVar63._8_4_ = auVar75._8_4_ * fVar199;
  auVar63._12_4_ = auVar75._12_4_ * fVar210;
  auVar63._16_4_ = auVar75._16_4_ * fVar211;
  auVar63._20_4_ = auVar75._20_4_ * fVar105;
  auVar63._24_4_ = auVar75._24_4_ * fVar106;
  auVar63._28_4_ = auVar62._28_4_;
  auVar36 = vfmadd231ps_fma(auVar77,auVar64,auVar65);
  auVar47 = vfmadd231ps_fma(auVar76,auVar64,auVar82);
  auVar46 = vfmadd231ps_fma(auVar63,auVar74,auVar64);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar138,auVar67);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar138,auVar81);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar73,auVar138);
  auVar145._4_4_ = fVar129;
  auVar145._0_4_ = fVar129;
  auVar145._8_4_ = fVar129;
  auVar145._12_4_ = fVar129;
  auVar145._16_4_ = fVar129;
  auVar145._20_4_ = fVar129;
  auVar145._24_4_ = fVar129;
  auVar145._28_4_ = fVar129;
  auVar63 = ZEXT1632(CONCAT412(fVar215 * auVar49._12_4_,
                               CONCAT48(fVar215 * auVar49._8_4_,
                                        CONCAT44(fVar215 * auVar49._4_4_,fVar129))));
  auVar76 = vpermps_avx2(auVar248,auVar63);
  auVar63 = vpermps_avx512vl(auVar61,auVar63);
  auVar64 = vmulps_avx512vl(auVar63,auVar66);
  auVar79._0_4_ = auVar63._0_4_ * auVar83._0_4_;
  auVar79._4_4_ = auVar63._4_4_ * auVar83._4_4_;
  auVar79._8_4_ = auVar63._8_4_ * auVar83._8_4_;
  auVar79._12_4_ = auVar63._12_4_ * auVar83._12_4_;
  auVar79._16_4_ = auVar63._16_4_ * auVar83._16_4_;
  auVar79._20_4_ = auVar63._20_4_ * auVar83._20_4_;
  auVar79._24_4_ = auVar63._24_4_ * auVar83._24_4_;
  auVar79._28_4_ = 0;
  auVar83._4_4_ = auVar63._4_4_ * auVar75._4_4_;
  auVar83._0_4_ = auVar63._0_4_ * auVar75._0_4_;
  auVar83._8_4_ = auVar63._8_4_ * auVar75._8_4_;
  auVar83._12_4_ = auVar63._12_4_ * auVar75._12_4_;
  auVar83._16_4_ = auVar63._16_4_ * auVar75._16_4_;
  auVar83._20_4_ = auVar63._20_4_ * auVar75._20_4_;
  auVar83._24_4_ = auVar63._24_4_ * auVar75._24_4_;
  auVar83._28_4_ = auVar66._28_4_;
  auVar65 = vfmadd231ps_avx512vl(auVar64,auVar76,auVar65);
  auVar45 = vfmadd231ps_fma(auVar79,auVar76,auVar82);
  auVar44 = vfmadd231ps_fma(auVar83,auVar76,auVar74);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar145,auVar67);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar145,auVar81);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar145,auVar73);
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar84._16_4_ = 0x7fffffff;
  auVar84._20_4_ = 0x7fffffff;
  auVar84._24_4_ = 0x7fffffff;
  auVar84._28_4_ = 0x7fffffff;
  auVar67 = vandps_avx(ZEXT1632(auVar36),auVar84);
  auVar86._8_4_ = 0x219392ef;
  auVar86._0_8_ = 0x219392ef219392ef;
  auVar86._12_4_ = 0x219392ef;
  auVar86._16_4_ = 0x219392ef;
  auVar86._20_4_ = 0x219392ef;
  auVar86._24_4_ = 0x219392ef;
  auVar86._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar67,auVar86,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar64._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._12_4_;
  auVar64._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar64._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar64._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar64._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar67 = vandps_avx(ZEXT1632(auVar47),auVar84);
  uVar33 = vcmpps_avx512vl(auVar67,auVar86,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar61._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar47._12_4_;
  auVar61._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar61._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar61._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar61._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar67 = vandps_avx(ZEXT1632(auVar46),auVar84);
  uVar33 = vcmpps_avx512vl(auVar67,auVar86,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar67._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar66 = vrcp14ps_avx512vl(auVar64);
  auVar85._8_4_ = 0x3f800000;
  auVar85._0_8_ = &DAT_3f8000003f800000;
  auVar85._12_4_ = 0x3f800000;
  auVar85._16_4_ = 0x3f800000;
  auVar85._20_4_ = 0x3f800000;
  auVar85._24_4_ = 0x3f800000;
  auVar85._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar64,auVar66,auVar85);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar61);
  auVar47 = vfnmadd213ps_fma(auVar61,auVar66,auVar85);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar67);
  auVar46 = vfnmadd213ps_fma(auVar67,auVar66,auVar85);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar66,auVar66);
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vsubps_avx512vl(auVar67,auVar65);
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar73._4_4_ = auVar36._4_4_ * auVar66._4_4_;
  auVar73._0_4_ = auVar36._0_4_ * auVar66._0_4_;
  auVar73._8_4_ = auVar36._8_4_ * auVar66._8_4_;
  auVar73._12_4_ = auVar36._12_4_ * auVar66._12_4_;
  auVar73._16_4_ = auVar66._16_4_ * 0.0;
  auVar73._20_4_ = auVar66._20_4_ * 0.0;
  auVar73._24_4_ = auVar66._24_4_ * 0.0;
  auVar73._28_4_ = auVar66._28_4_;
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx512vl(auVar67,auVar65);
  auVar80._0_4_ = auVar36._0_4_ * auVar67._0_4_;
  auVar80._4_4_ = auVar36._4_4_ * auVar67._4_4_;
  auVar80._8_4_ = auVar36._8_4_ * auVar67._8_4_;
  auVar80._12_4_ = auVar36._12_4_ * auVar67._12_4_;
  auVar80._16_4_ = auVar67._16_4_ * 0.0;
  auVar80._20_4_ = auVar67._20_4_ * 0.0;
  auVar80._24_4_ = auVar67._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar65 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar26 * -2 + 6));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,ZEXT1632(auVar45));
  auVar74._4_4_ = auVar47._4_4_ * auVar67._4_4_;
  auVar74._0_4_ = auVar47._0_4_ * auVar67._0_4_;
  auVar74._8_4_ = auVar47._8_4_ * auVar67._8_4_;
  auVar74._12_4_ = auVar47._12_4_ * auVar67._12_4_;
  auVar74._16_4_ = auVar67._16_4_ * 0.0;
  auVar74._20_4_ = auVar67._20_4_ * 0.0;
  auVar74._24_4_ = auVar67._24_4_ * 0.0;
  auVar74._28_4_ = auVar67._28_4_;
  auVar67 = vcvtdq2ps_avx(auVar65);
  auVar67 = vsubps_avx(auVar67,ZEXT1632(auVar45));
  auVar78._0_4_ = auVar47._0_4_ * auVar67._0_4_;
  auVar78._4_4_ = auVar47._4_4_ * auVar67._4_4_;
  auVar78._8_4_ = auVar47._8_4_ * auVar67._8_4_;
  auVar78._12_4_ = auVar47._12_4_ * auVar67._12_4_;
  auVar78._16_4_ = auVar67._16_4_ * 0.0;
  auVar78._20_4_ = auVar67._20_4_ * 0.0;
  auVar78._24_4_ = auVar67._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar26 + 6));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,ZEXT1632(auVar44));
  auVar75._4_4_ = auVar67._4_4_ * auVar46._4_4_;
  auVar75._0_4_ = auVar67._0_4_ * auVar46._0_4_;
  auVar75._8_4_ = auVar67._8_4_ * auVar46._8_4_;
  auVar75._12_4_ = auVar67._12_4_ * auVar46._12_4_;
  auVar75._16_4_ = auVar67._16_4_ * 0.0;
  auVar75._20_4_ = auVar67._20_4_ * 0.0;
  auVar75._24_4_ = auVar67._24_4_ * 0.0;
  auVar75._28_4_ = auVar67._28_4_;
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,ZEXT1632(auVar44));
  auVar62._0_4_ = auVar46._0_4_ * auVar67._0_4_;
  auVar62._4_4_ = auVar46._4_4_ * auVar67._4_4_;
  auVar62._8_4_ = auVar46._8_4_ * auVar67._8_4_;
  auVar62._12_4_ = auVar46._12_4_ * auVar67._12_4_;
  auVar62._16_4_ = auVar67._16_4_ * 0.0;
  auVar62._20_4_ = auVar67._20_4_ * 0.0;
  auVar62._24_4_ = auVar67._24_4_ * 0.0;
  auVar62._28_4_ = 0;
  auVar67 = vpminsd_avx2(auVar73,auVar80);
  auVar65 = vpminsd_avx2(auVar74,auVar78);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar65 = vpminsd_avx2(auVar75,auVar62);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar66._4_4_ = uVar107;
  auVar66._0_4_ = uVar107;
  auVar66._8_4_ = uVar107;
  auVar66._12_4_ = uVar107;
  auVar66._16_4_ = uVar107;
  auVar66._20_4_ = uVar107;
  auVar66._24_4_ = uVar107;
  auVar66._28_4_ = uVar107;
  auVar65 = vmaxps_avx512vl(auVar65,auVar66);
  auVar67 = vmaxps_avx(auVar67,auVar65);
  auVar65._8_4_ = 0x3f7ffffa;
  auVar65._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar65._12_4_ = 0x3f7ffffa;
  auVar65._16_4_ = 0x3f7ffffa;
  auVar65._20_4_ = 0x3f7ffffa;
  auVar65._24_4_ = 0x3f7ffffa;
  auVar65._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar67,auVar65);
  auVar67 = vpmaxsd_avx2(auVar73,auVar80);
  auVar65 = vpmaxsd_avx2(auVar74,auVar78);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar65 = vpmaxsd_avx2(auVar75,auVar62);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar81._4_4_ = uVar107;
  auVar81._0_4_ = uVar107;
  auVar81._8_4_ = uVar107;
  auVar81._12_4_ = uVar107;
  auVar81._16_4_ = uVar107;
  auVar81._20_4_ = uVar107;
  auVar81._24_4_ = uVar107;
  auVar81._28_4_ = uVar107;
  auVar65 = vminps_avx512vl(auVar65,auVar81);
  auVar67 = vminps_avx(auVar67,auVar65);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar82._16_4_ = 0x3f800003;
  auVar82._20_4_ = 0x3f800003;
  auVar82._24_4_ = 0x3f800003;
  auVar82._28_4_ = 0x3f800003;
  auVar67 = vmulps_avx512vl(auVar67,auVar82);
  auVar65 = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar65,_DAT_0205a920);
  uVar10 = vcmpps_avx512vl(local_200,auVar67,2);
  bVar34 = (byte)((byte)uVar10 & (byte)uVar12) == 0;
  local_5a1 = !bVar34;
  if (bVar34) {
    return local_5a1;
  }
  uVar33 = (ulong)(byte)((byte)uVar10 & (byte)uVar12);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar68._16_16_ = auVar65._16_16_;
  auVar36 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar258 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar250 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar251 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar252 = ZEXT1664(auVar36);
  auVar68._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar257 = ZEXT1664(auVar68._0_16_);
LAB_01d68563:
  lVar30 = 0;
  for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar32 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar32].ptr;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar30 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar36 = *(undefined1 (*) [16])(_Var9 + uVar26 * (long)pvVar8);
  auVar47 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 1) * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 2) * (long)pvVar8);
  auVar45 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar26 + 3));
  lVar30 = *(long *)&pGVar6[1].time_range.upper;
  auVar44 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * uVar26);
  auVar43 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 1));
  auVar42 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 2));
  uVar33 = uVar33 - 1 & uVar33;
  auVar41 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 3));
  if (uVar33 != 0) {
    uVar31 = uVar33 - 1 & uVar33;
    for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    }
    if (uVar31 != 0) {
      for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar70._16_16_ = auVar68._16_16_;
  auVar48 = auVar258._0_16_;
  auVar37 = vmulps_avx512vl(auVar41,auVar48);
  auVar240._8_4_ = 0x3e2aaaab;
  auVar240._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar240._12_4_ = 0x3e2aaaab;
  auVar38 = vfmadd213ps_fma(auVar240,auVar42,auVar37);
  auVar246._8_4_ = 0x3f2aaaab;
  auVar246._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar246._12_4_ = 0x3f2aaaab;
  auVar38 = vfmadd231ps_fma(auVar38,auVar43,auVar246);
  auVar49 = vfmadd231ps_fma(auVar38,auVar44,auVar240);
  auVar117 = auVar250._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar117);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar43,auVar48);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar44,auVar117);
  auVar37 = vmulps_avx512vl(auVar45,auVar48);
  auVar38 = vfmadd213ps_fma(auVar240,auVar46,auVar37);
  auVar38 = vfmadd231ps_fma(auVar38,auVar47,auVar246);
  auVar38 = vfmadd231ps_fma(auVar38,auVar36,auVar240);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar46,auVar117);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar47,auVar48);
  auVar40 = vfnmadd231ps_avx512vl(auVar37,auVar36,auVar117);
  auVar130._0_4_ = auVar41._0_4_ * 0.16666667;
  auVar130._4_4_ = auVar41._4_4_ * 0.16666667;
  auVar130._8_4_ = auVar41._8_4_ * 0.16666667;
  auVar130._12_4_ = auVar41._12_4_ * 0.16666667;
  auVar37 = vfmadd231ps_fma(auVar130,auVar42,auVar246);
  auVar37 = vfmadd231ps_fma(auVar37,auVar43,auVar240);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar44,auVar48);
  auVar41 = vmulps_avx512vl(auVar41,auVar117);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar42);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar117,auVar43);
  auVar42 = vfnmadd231ps_avx512vl(auVar43,auVar48,auVar44);
  auVar190._0_4_ = auVar45._0_4_ * 0.16666667;
  auVar190._4_4_ = auVar45._4_4_ * 0.16666667;
  auVar190._8_4_ = auVar45._8_4_ * 0.16666667;
  auVar190._12_4_ = auVar45._12_4_ * 0.16666667;
  auVar44 = vfmadd231ps_fma(auVar190,auVar46,auVar246);
  auVar44 = vfmadd231ps_fma(auVar44,auVar47,auVar240);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar36,auVar48);
  auVar45 = vmulps_avx512vl(auVar45,auVar117);
  auVar46 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar46);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar117,auVar47);
  auVar43 = vfnmadd231ps_avx512vl(auVar47,auVar48,auVar36);
  auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar47 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar210 = auVar39._0_4_;
  auVar57._0_4_ = fVar210 * auVar47._0_4_;
  fVar211 = auVar39._4_4_;
  auVar57._4_4_ = fVar211 * auVar47._4_4_;
  fVar105 = auVar39._8_4_;
  auVar57._8_4_ = fVar105 * auVar47._8_4_;
  fVar106 = auVar39._12_4_;
  auVar57._12_4_ = fVar106 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar57,auVar36,auVar38);
  auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar54._0_4_ = fVar210 * auVar47._0_4_;
  auVar54._4_4_ = fVar211 * auVar47._4_4_;
  auVar54._8_4_ = fVar105 * auVar47._8_4_;
  auVar54._12_4_ = fVar106 * auVar47._12_4_;
  auVar36 = vfmsub231ps_fma(auVar54,auVar36,auVar40);
  auVar45 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar47 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar129 = auVar42._0_4_;
  auVar58._0_4_ = fVar129 * auVar47._0_4_;
  fVar148 = auVar42._4_4_;
  auVar58._4_4_ = fVar148 * auVar47._4_4_;
  fVar212 = auVar42._8_4_;
  auVar58._8_4_ = fVar212 * auVar47._8_4_;
  fVar213 = auVar42._12_4_;
  auVar58._12_4_ = fVar213 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar58,auVar36,auVar44);
  auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar191._0_4_ = auVar47._0_4_ * fVar129;
  auVar191._4_4_ = auVar47._4_4_ * fVar148;
  auVar191._8_4_ = auVar47._8_4_ * fVar212;
  auVar191._12_4_ = auVar47._12_4_ * fVar213;
  auVar36 = vfmsub231ps_fma(auVar191,auVar36,auVar43);
  auVar43 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar103 = auVar36._0_4_;
  auVar70._0_16_ = auVar48;
  auVar69._4_28_ = auVar70._4_28_;
  auVar69._0_4_ = fVar103;
  auVar47 = vrsqrt14ss_avx512f(auVar48,auVar69._0_16_);
  fVar215 = auVar47._0_4_;
  auVar47 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
  fVar215 = fVar215 * 1.5 + auVar47._0_4_ * fVar215 * fVar215 * fVar215;
  fVar227 = fVar215 * auVar46._0_4_;
  fVar234 = fVar215 * auVar46._4_4_;
  fVar235 = fVar215 * auVar46._8_4_;
  fVar236 = fVar215 * auVar46._12_4_;
  auVar47 = vdpps_avx(auVar46,auVar45,0x7f);
  auVar200._0_4_ = auVar45._0_4_ * fVar103;
  auVar200._4_4_ = auVar45._4_4_ * fVar103;
  auVar200._8_4_ = auVar45._8_4_ * fVar103;
  auVar200._12_4_ = auVar45._12_4_ * fVar103;
  fVar103 = auVar47._0_4_;
  auVar163._0_4_ = fVar103 * auVar46._0_4_;
  auVar163._4_4_ = fVar103 * auVar46._4_4_;
  auVar163._8_4_ = fVar103 * auVar46._8_4_;
  auVar163._12_4_ = fVar103 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar200,auVar163);
  auVar47 = vrcp14ss_avx512f(auVar48,auVar69._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar47,ZEXT416(0x40000000));
  fVar214 = auVar47._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar199 = auVar36._0_4_;
  auVar72._16_16_ = auVar70._16_16_;
  auVar72._0_16_ = auVar48;
  auVar71._4_28_ = auVar72._4_28_;
  auVar71._0_4_ = fVar199;
  auVar47 = vrsqrt14ss_avx512f(auVar48,auVar71._0_16_);
  fVar103 = auVar47._0_4_;
  auVar47 = vmulss_avx512f(auVar36,ZEXT416(0xbf000000));
  fVar103 = fVar103 * 1.5 + auVar47._0_4_ * fVar103 * fVar103 * fVar103;
  fVar216 = fVar103 * auVar44._0_4_;
  fVar224 = fVar103 * auVar44._4_4_;
  fVar225 = fVar103 * auVar44._8_4_;
  fVar226 = fVar103 * auVar44._12_4_;
  auVar47 = vdpps_avx(auVar44,auVar43,0x7f);
  auVar55._0_4_ = fVar199 * auVar43._0_4_;
  auVar55._4_4_ = fVar199 * auVar43._4_4_;
  auVar55._8_4_ = fVar199 * auVar43._8_4_;
  auVar55._12_4_ = fVar199 * auVar43._12_4_;
  fVar199 = auVar47._0_4_;
  auVar59._0_4_ = fVar199 * auVar44._0_4_;
  auVar59._4_4_ = fVar199 * auVar44._4_4_;
  auVar59._8_4_ = fVar199 * auVar44._8_4_;
  auVar59._12_4_ = fVar199 * auVar44._12_4_;
  auVar45 = vsubps_avx(auVar55,auVar59);
  auVar47 = vrcp14ss_avx512f(auVar48,auVar71._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar47,ZEXT416(0x40000000));
  fVar199 = auVar36._0_4_ * auVar47._0_4_;
  auVar36 = vshufps_avx(auVar49,auVar49,0xff);
  auVar181._0_4_ = fVar227 * auVar36._0_4_;
  auVar181._4_4_ = fVar234 * auVar36._4_4_;
  auVar181._8_4_ = fVar235 * auVar36._8_4_;
  auVar181._12_4_ = fVar236 * auVar36._12_4_;
  local_310 = vsubps_avx(auVar49,auVar181);
  auVar47 = vshufps_avx(auVar39,auVar39,0xff);
  auVar56._0_4_ = auVar47._0_4_ * fVar227 + auVar36._0_4_ * fVar215 * fVar214 * auVar46._0_4_;
  auVar56._4_4_ = auVar47._4_4_ * fVar234 + auVar36._4_4_ * fVar215 * fVar214 * auVar46._4_4_;
  auVar56._8_4_ = auVar47._8_4_ * fVar235 + auVar36._8_4_ * fVar215 * fVar214 * auVar46._8_4_;
  auVar56._12_4_ = auVar47._12_4_ * fVar236 + auVar36._12_4_ * fVar215 * fVar214 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar39,auVar56);
  local_320._0_4_ = auVar181._0_4_ + auVar49._0_4_;
  local_320._4_4_ = auVar181._4_4_ + auVar49._4_4_;
  fStack_318 = auVar181._8_4_ + auVar49._8_4_;
  fStack_314 = auVar181._12_4_ + auVar49._12_4_;
  auVar36 = vshufps_avx(auVar37,auVar37,0xff);
  auVar156._0_4_ = fVar216 * auVar36._0_4_;
  auVar156._4_4_ = fVar224 * auVar36._4_4_;
  auVar156._8_4_ = fVar225 * auVar36._8_4_;
  auVar156._12_4_ = fVar226 * auVar36._12_4_;
  local_330 = vsubps_avx(auVar37,auVar156);
  auVar47 = vshufps_avx(auVar42,auVar42,0xff);
  auVar39._0_4_ = auVar47._0_4_ * fVar216 + auVar36._0_4_ * fVar103 * auVar45._0_4_ * fVar199;
  auVar39._4_4_ = auVar47._4_4_ * fVar224 + auVar36._4_4_ * fVar103 * auVar45._4_4_ * fVar199;
  auVar39._8_4_ = auVar47._8_4_ * fVar225 + auVar36._8_4_ * fVar103 * auVar45._8_4_ * fVar199;
  auVar39._12_4_ = auVar47._12_4_ * fVar226 + auVar36._12_4_ * fVar103 * auVar45._12_4_ * fVar199;
  auVar36 = vsubps_avx(auVar42,auVar39);
  _local_340 = vaddps_avx512vl(auVar37,auVar156);
  auVar53._0_4_ = auVar46._0_4_ * 0.33333334;
  auVar53._4_4_ = auVar46._4_4_ * 0.33333334;
  auVar53._8_4_ = auVar46._8_4_ * 0.33333334;
  auVar53._12_4_ = auVar46._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar53);
  auVar50._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar50._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar50._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar50._12_4_ = auVar36._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar50);
  auVar38._0_4_ = (fVar210 + auVar56._0_4_) * 0.33333334;
  auVar38._4_4_ = (fVar211 + auVar56._4_4_) * 0.33333334;
  auVar38._8_4_ = (fVar105 + auVar56._8_4_) * 0.33333334;
  auVar38._12_4_ = (fVar106 + auVar56._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar38);
  auVar49._0_4_ = (fVar129 + auVar39._0_4_) * 0.33333334;
  auVar49._4_4_ = (fVar148 + auVar39._4_4_) * 0.33333334;
  auVar49._8_4_ = (fVar212 + auVar39._8_4_) * 0.33333334;
  auVar49._12_4_ = (fVar213 + auVar39._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar49);
  local_290 = vsubps_avx(local_310,auVar3);
  uVar107 = local_290._0_4_;
  auVar40._4_4_ = uVar107;
  auVar40._0_4_ = uVar107;
  auVar40._8_4_ = uVar107;
  auVar40._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_290,local_290,0x55);
  auVar47 = vshufps_avx(local_290,local_290,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar215 = pre->ray_space[k].vz.field_0.m128[0];
  fVar103 = pre->ray_space[k].vz.field_0.m128[1];
  fVar214 = pre->ray_space[k].vz.field_0.m128[2];
  fVar199 = pre->ray_space[k].vz.field_0.m128[3];
  auVar37._0_4_ = fVar215 * auVar47._0_4_;
  auVar37._4_4_ = fVar103 * auVar47._4_4_;
  auVar37._8_4_ = fVar214 * auVar47._8_4_;
  auVar37._12_4_ = fVar199 * auVar47._12_4_;
  auVar36 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar2,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar40);
  local_2a0 = vsubps_avx512vl(local_350,auVar3);
  uVar107 = local_2a0._0_4_;
  auVar52._4_4_ = uVar107;
  auVar52._0_4_ = uVar107;
  auVar52._8_4_ = uVar107;
  auVar52._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar47 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar117._0_4_ = fVar215 * auVar47._0_4_;
  auVar117._4_4_ = fVar103 * auVar47._4_4_;
  auVar117._8_4_ = fVar214 * auVar47._8_4_;
  auVar117._12_4_ = fVar199 * auVar47._12_4_;
  auVar36 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar2,auVar36);
  auVar49 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar52);
  local_2b0 = vsubps_avx512vl(local_360,auVar3);
  uVar107 = local_2b0._0_4_;
  auVar164._4_4_ = uVar107;
  auVar164._0_4_ = uVar107;
  auVar164._8_4_ = uVar107;
  auVar164._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar47 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar51._0_4_ = fVar215 * auVar47._0_4_;
  auVar51._4_4_ = fVar103 * auVar47._4_4_;
  auVar51._8_4_ = fVar214 * auVar47._8_4_;
  auVar51._12_4_ = fVar199 * auVar47._12_4_;
  auVar36 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar2,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar164);
  local_2c0 = vsubps_avx(local_330,auVar3);
  uVar107 = local_2c0._0_4_;
  auVar60._4_4_ = uVar107;
  auVar60._0_4_ = uVar107;
  auVar60._8_4_ = uVar107;
  auVar60._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar47 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar192._0_4_ = auVar47._0_4_ * fVar215;
  auVar192._4_4_ = auVar47._4_4_ * fVar103;
  auVar192._8_4_ = auVar47._8_4_ * fVar214;
  auVar192._12_4_ = auVar47._12_4_ * fVar199;
  auVar36 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar2,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar60);
  local_2d0 = vsubps_avx(_local_320,auVar3);
  uVar107 = local_2d0._0_4_;
  auVar165._4_4_ = uVar107;
  auVar165._0_4_ = uVar107;
  auVar165._8_4_ = uVar107;
  auVar165._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar47 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar201._0_4_ = auVar47._0_4_ * fVar215;
  auVar201._4_4_ = auVar47._4_4_ * fVar103;
  auVar201._8_4_ = auVar47._8_4_ * fVar214;
  auVar201._12_4_ = auVar47._12_4_ * fVar199;
  auVar36 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar165);
  local_2e0 = vsubps_avx512vl(_local_370,auVar3);
  uVar107 = local_2e0._0_4_;
  auVar166._4_4_ = uVar107;
  auVar166._0_4_ = uVar107;
  auVar166._8_4_ = uVar107;
  auVar166._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar47 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar217._0_4_ = auVar47._0_4_ * fVar215;
  auVar217._4_4_ = auVar47._4_4_ * fVar103;
  auVar217._8_4_ = auVar47._8_4_ * fVar214;
  auVar217._12_4_ = auVar47._12_4_ * fVar199;
  auVar36 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar36);
  auVar117 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar166);
  local_2f0 = vsubps_avx512vl(_local_380,auVar3);
  uVar107 = local_2f0._0_4_;
  auVar167._4_4_ = uVar107;
  auVar167._0_4_ = uVar107;
  auVar167._8_4_ = uVar107;
  auVar167._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar47 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar228._0_4_ = auVar47._0_4_ * fVar215;
  auVar228._4_4_ = auVar47._4_4_ * fVar103;
  auVar228._8_4_ = auVar47._8_4_ * fVar214;
  auVar228._12_4_ = auVar47._12_4_ * fVar199;
  auVar36 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar2,auVar36);
  auVar130 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar167);
  local_300 = vsubps_avx512vl(_local_340,auVar3);
  uVar107 = local_300._0_4_;
  auVar48._4_4_ = uVar107;
  auVar48._0_4_ = uVar107;
  auVar48._8_4_ = uVar107;
  auVar48._12_4_ = uVar107;
  auVar36 = vshufps_avx(local_300,local_300,0x55);
  auVar47 = vshufps_avx(local_300,local_300,0xaa);
  auVar157._0_4_ = auVar47._0_4_ * fVar215;
  auVar157._4_4_ = auVar47._4_4_ * fVar103;
  auVar157._8_4_ = auVar47._8_4_ * fVar214;
  auVar157._12_4_ = auVar47._12_4_ * fVar199;
  auVar36 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar2,auVar36);
  auVar3 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar48);
  auVar46 = vmovlhps_avx(auVar38,auVar40);
  auVar43 = vmovlhps_avx512f(auVar49,auVar117);
  auVar42 = vmovlhps_avx512f(auVar37,auVar130);
  auVar41 = vmovlhps_avx512f(auVar39,auVar3);
  auVar36 = vminps_avx512vl(auVar46,auVar43);
  auVar45 = vmaxps_avx512vl(auVar46,auVar43);
  auVar47 = vminps_avx512vl(auVar42,auVar41);
  auVar47 = vminps_avx(auVar36,auVar47);
  auVar36 = vmaxps_avx512vl(auVar42,auVar41);
  auVar36 = vmaxps_avx(auVar45,auVar36);
  auVar45 = vshufpd_avx(auVar47,auVar47,3);
  auVar44 = vshufpd_avx(auVar36,auVar36,3);
  auVar47 = vminps_avx(auVar47,auVar45);
  auVar36 = vmaxps_avx(auVar36,auVar44);
  auVar47 = vandps_avx512vl(auVar47,auVar251._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar251._0_16_);
  auVar36 = vmaxps_avx(auVar47,auVar36);
  auVar47 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar47,auVar36);
  fVar103 = auVar36._0_4_ * 9.536743e-07;
  auVar168._8_8_ = auVar38._0_8_;
  auVar168._0_8_ = auVar38._0_8_;
  auVar47 = vmovddup_avx512vl(auVar49);
  auVar108._8_8_ = auVar37._0_8_;
  auVar108._0_8_ = auVar37._0_8_;
  auVar118._8_8_ = auVar39._0_8_;
  auVar118._0_8_ = auVar39._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar103));
  auVar36 = vxorps_avx512vl(local_1c0._0_16_,auVar252._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar36);
  local_220 = vpbroadcastd_avx512vl();
  bVar34 = false;
  uVar26 = 0;
  fVar215 = *(float *)(ray + k * 4 + 0x60);
  auVar45 = vsubps_avx512vl(auVar43,auVar46);
  auVar44 = vsubps_avx512vl(auVar42,auVar43);
  auVar87._0_16_ = vsubps_avx512vl(auVar41,auVar42);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_240 = vpbroadcastd_avx512vl();
  auVar36 = ZEXT816(0x3f80000000000000);
  auVar249 = ZEXT1664(auVar36);
  do {
    auVar52 = auVar249._0_16_;
    auVar38 = vshufps_avx(auVar52,auVar52,0x50);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar37 = vsubps_avx512vl(auVar73._0_16_,auVar38);
    fVar214 = auVar38._0_4_;
    fVar226 = auVar40._0_4_;
    auVar131._0_4_ = fVar226 * fVar214;
    fVar199 = auVar38._4_4_;
    fVar227 = auVar40._4_4_;
    auVar131._4_4_ = fVar227 * fVar199;
    fVar210 = auVar38._8_4_;
    auVar131._8_4_ = fVar226 * fVar210;
    fVar211 = auVar38._12_4_;
    auVar131._12_4_ = fVar227 * fVar211;
    fVar105 = auVar117._0_4_;
    auVar141._0_4_ = fVar105 * fVar214;
    fVar106 = auVar117._4_4_;
    auVar141._4_4_ = fVar106 * fVar199;
    auVar141._8_4_ = fVar105 * fVar210;
    auVar141._12_4_ = fVar106 * fVar211;
    fVar129 = auVar130._0_4_;
    auVar149._0_4_ = fVar129 * fVar214;
    fVar148 = auVar130._4_4_;
    auVar149._4_4_ = fVar148 * fVar199;
    auVar149._8_4_ = fVar129 * fVar210;
    auVar149._12_4_ = fVar148 * fVar211;
    fVar224 = auVar3._0_4_;
    auVar109._0_4_ = fVar224 * fVar214;
    fVar225 = auVar3._4_4_;
    auVar109._4_4_ = fVar225 * fVar199;
    auVar109._8_4_ = fVar224 * fVar210;
    auVar109._12_4_ = fVar225 * fVar211;
    auVar49 = vfmadd231ps_fma(auVar131,auVar37,auVar168);
    auVar39 = vfmadd231ps_avx512vl(auVar141,auVar37,auVar47);
    auVar48 = vfmadd231ps_avx512vl(auVar149,auVar37,auVar108);
    auVar37 = vfmadd231ps_fma(auVar109,auVar118,auVar37);
    auVar38 = vmovshdup_avx(auVar36);
    fVar199 = auVar36._0_4_;
    fVar214 = (auVar38._0_4_ - fVar199) * 0.04761905;
    auVar180._4_4_ = fVar199;
    auVar180._0_4_ = fVar199;
    auVar180._8_4_ = fVar199;
    auVar180._12_4_ = fVar199;
    auVar180._16_4_ = fVar199;
    auVar180._20_4_ = fVar199;
    auVar180._24_4_ = fVar199;
    auVar180._28_4_ = fVar199;
    auVar126._0_8_ = auVar38._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar126._16_8_ = auVar126._0_8_;
    auVar126._24_8_ = auVar126._0_8_;
    auVar67 = vsubps_avx(auVar126,auVar180);
    uVar107 = auVar49._0_4_;
    auVar127._4_4_ = uVar107;
    auVar127._0_4_ = uVar107;
    auVar127._8_4_ = uVar107;
    auVar127._12_4_ = uVar107;
    auVar127._16_4_ = uVar107;
    auVar127._20_4_ = uVar107;
    auVar127._24_4_ = uVar107;
    auVar127._28_4_ = uVar107;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar66 = ZEXT1632(auVar49);
    auVar65 = vpermps_avx2(auVar196,auVar66);
    auVar74 = vbroadcastss_avx512vl(auVar39);
    auVar81 = ZEXT1632(auVar39);
    auVar75 = vpermps_avx512vl(auVar196,auVar81);
    auVar76 = vbroadcastss_avx512vl(auVar48);
    auVar83 = ZEXT1632(auVar48);
    auVar63 = vpermps_avx512vl(auVar196,auVar83);
    auVar64 = vbroadcastss_avx512vl(auVar37);
    auVar79 = ZEXT1632(auVar37);
    auVar77 = vpermps_avx512vl(auVar196,auVar79);
    auVar197._4_4_ = fVar214;
    auVar197._0_4_ = fVar214;
    auVar197._8_4_ = fVar214;
    auVar197._12_4_ = fVar214;
    auVar197._16_4_ = fVar214;
    auVar197._20_4_ = fVar214;
    auVar197._24_4_ = fVar214;
    auVar197._28_4_ = fVar214;
    auVar239._8_4_ = 2;
    auVar239._0_8_ = 0x200000002;
    auVar239._12_4_ = 2;
    auVar239._16_4_ = 2;
    auVar239._20_4_ = 2;
    auVar239._24_4_ = 2;
    auVar239._28_4_ = 2;
    auVar61 = vpermps_avx512vl(auVar239,auVar66);
    auVar161._8_4_ = 3;
    auVar161._0_8_ = 0x300000003;
    auVar161._12_4_ = 3;
    auVar161._16_4_ = 3;
    auVar161._20_4_ = 3;
    auVar161._24_4_ = 3;
    auVar161._28_4_ = 3;
    auVar62 = vpermps_avx512vl(auVar161,auVar66);
    auVar66 = vpermps_avx2(auVar239,auVar81);
    auVar81 = vpermps_avx2(auVar161,auVar81);
    auVar82 = vpermps_avx2(auVar239,auVar83);
    auVar83 = vpermps_avx2(auVar161,auVar83);
    auVar78 = vpermps_avx512vl(auVar239,auVar79);
    auVar79 = vpermps_avx512vl(auVar161,auVar79);
    auVar38 = vfmadd132ps_fma(auVar67,auVar180,_DAT_02020f20);
    auVar73 = vsubps_avx512vl(auVar73,ZEXT1632(auVar38));
    auVar67 = vmulps_avx512vl(auVar74,ZEXT1632(auVar38));
    auVar84 = ZEXT1632(auVar38);
    auVar80 = vmulps_avx512vl(auVar75,auVar84);
    auVar49 = vfmadd231ps_fma(auVar67,auVar73,auVar127);
    auVar37 = vfmadd231ps_fma(auVar80,auVar73,auVar65);
    auVar67 = vmulps_avx512vl(auVar76,auVar84);
    auVar80 = vmulps_avx512vl(auVar63,auVar84);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar73,auVar74);
    auVar74 = vfmadd231ps_avx512vl(auVar80,auVar73,auVar75);
    auVar75 = vmulps_avx512vl(auVar64,auVar84);
    auVar80 = ZEXT1632(auVar38);
    auVar77 = vmulps_avx512vl(auVar77,auVar80);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar77,auVar73,auVar63);
    fVar210 = auVar38._0_4_;
    fVar211 = auVar38._4_4_;
    auVar15._4_4_ = fVar211 * auVar67._4_4_;
    auVar15._0_4_ = fVar210 * auVar67._0_4_;
    fVar212 = auVar38._8_4_;
    auVar15._8_4_ = fVar212 * auVar67._8_4_;
    fVar213 = auVar38._12_4_;
    auVar15._12_4_ = fVar213 * auVar67._12_4_;
    auVar15._16_4_ = auVar67._16_4_ * 0.0;
    auVar15._20_4_ = auVar67._20_4_ * 0.0;
    auVar15._24_4_ = auVar67._24_4_ * 0.0;
    auVar15._28_4_ = fVar199;
    auVar16._4_4_ = fVar211 * auVar74._4_4_;
    auVar16._0_4_ = fVar210 * auVar74._0_4_;
    auVar16._8_4_ = fVar212 * auVar74._8_4_;
    auVar16._12_4_ = fVar213 * auVar74._12_4_;
    auVar16._16_4_ = auVar74._16_4_ * 0.0;
    auVar16._20_4_ = auVar74._20_4_ * 0.0;
    auVar16._24_4_ = auVar74._24_4_ * 0.0;
    auVar16._28_4_ = auVar65._28_4_;
    auVar49 = vfmadd231ps_fma(auVar15,auVar73,ZEXT1632(auVar49));
    auVar37 = vfmadd231ps_fma(auVar16,auVar73,ZEXT1632(auVar37));
    auVar115._0_4_ = fVar210 * auVar75._0_4_;
    auVar115._4_4_ = fVar211 * auVar75._4_4_;
    auVar115._8_4_ = fVar212 * auVar75._8_4_;
    auVar115._12_4_ = fVar213 * auVar75._12_4_;
    auVar115._16_4_ = auVar75._16_4_ * 0.0;
    auVar115._20_4_ = auVar75._20_4_ * 0.0;
    auVar115._24_4_ = auVar75._24_4_ * 0.0;
    auVar115._28_4_ = 0;
    auVar17._4_4_ = fVar211 * auVar76._4_4_;
    auVar17._0_4_ = fVar210 * auVar76._0_4_;
    auVar17._8_4_ = fVar212 * auVar76._8_4_;
    auVar17._12_4_ = fVar213 * auVar76._12_4_;
    auVar17._16_4_ = auVar76._16_4_ * 0.0;
    auVar17._20_4_ = auVar76._20_4_ * 0.0;
    auVar17._24_4_ = auVar76._24_4_ * 0.0;
    auVar17._28_4_ = auVar75._28_4_;
    auVar39 = vfmadd231ps_fma(auVar115,auVar73,auVar67);
    auVar48 = vfmadd231ps_fma(auVar17,auVar73,auVar74);
    auVar18._28_4_ = auVar74._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * auVar48._12_4_,
                            CONCAT48(fVar212 * auVar48._8_4_,
                                     CONCAT44(fVar211 * auVar48._4_4_,fVar210 * auVar48._0_4_))));
    auVar53 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar39._12_4_,
                                                 CONCAT48(fVar212 * auVar39._8_4_,
                                                          CONCAT44(fVar211 * auVar39._4_4_,
                                                                   fVar210 * auVar39._0_4_)))),
                              auVar73,ZEXT1632(auVar49));
    auVar50 = vfmadd231ps_fma(auVar18,auVar73,ZEXT1632(auVar37));
    auVar67 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar49));
    auVar65 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar37));
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar67 = vmulps_avx512vl(auVar67,auVar74);
    auVar65 = vmulps_avx512vl(auVar65,auVar74);
    auVar189._0_4_ = fVar214 * auVar67._0_4_;
    auVar189._4_4_ = fVar214 * auVar67._4_4_;
    auVar189._8_4_ = fVar214 * auVar67._8_4_;
    auVar189._12_4_ = fVar214 * auVar67._12_4_;
    auVar189._16_4_ = fVar214 * auVar67._16_4_;
    auVar189._20_4_ = fVar214 * auVar67._20_4_;
    auVar189._24_4_ = fVar214 * auVar67._24_4_;
    auVar189._28_4_ = 0;
    auVar67 = vmulps_avx512vl(auVar197,auVar65);
    auVar39 = vxorps_avx512vl(auVar64._0_16_,auVar64._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar50),_DAT_0205fd20,ZEXT1632(auVar39));
    auVar116._0_4_ = auVar189._0_4_ + auVar53._0_4_;
    auVar116._4_4_ = auVar189._4_4_ + auVar53._4_4_;
    auVar116._8_4_ = auVar189._8_4_ + auVar53._8_4_;
    auVar116._12_4_ = auVar189._12_4_ + auVar53._12_4_;
    auVar116._16_4_ = auVar189._16_4_ + 0.0;
    auVar116._20_4_ = auVar189._20_4_ + 0.0;
    auVar116._24_4_ = auVar189._24_4_ + 0.0;
    auVar116._28_4_ = 0;
    auVar84 = ZEXT1632(auVar39);
    auVar65 = vpermt2ps_avx512vl(auVar189,_DAT_0205fd20,auVar84);
    auVar63 = vaddps_avx512vl(ZEXT1632(auVar50),auVar67);
    auVar64 = vpermt2ps_avx512vl(auVar67,_DAT_0205fd20,auVar84);
    auVar67 = vsubps_avx(auVar75,auVar65);
    auVar64 = vsubps_avx512vl(auVar76,auVar64);
    auVar65 = vmulps_avx512vl(auVar66,auVar80);
    auVar77 = vmulps_avx512vl(auVar81,auVar80);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar73,auVar61);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar73,auVar62);
    auVar61 = vmulps_avx512vl(auVar82,auVar80);
    auVar62 = vmulps_avx512vl(auVar83,auVar80);
    auVar66 = vfmadd231ps_avx512vl(auVar61,auVar73,auVar66);
    auVar81 = vfmadd231ps_avx512vl(auVar62,auVar73,auVar81);
    auVar61 = vmulps_avx512vl(auVar78,auVar80);
    auVar62 = vmulps_avx512vl(auVar79,auVar80);
    auVar49 = vfmadd231ps_fma(auVar61,auVar73,auVar82);
    auVar37 = vfmadd231ps_fma(auVar62,auVar73,auVar83);
    auVar61 = vmulps_avx512vl(auVar80,auVar66);
    auVar62 = vmulps_avx512vl(ZEXT1632(auVar38),auVar81);
    auVar65 = vfmadd231ps_avx512vl(auVar61,auVar73,auVar65);
    auVar77 = vfmadd231ps_avx512vl(auVar62,auVar73,auVar77);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar49._12_4_,
                                            CONCAT48(fVar212 * auVar49._8_4_,
                                                     CONCAT44(fVar211 * auVar49._4_4_,
                                                              fVar210 * auVar49._0_4_)))),auVar73,
                         auVar66);
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar37._12_4_,
                                            CONCAT48(fVar212 * auVar37._8_4_,
                                                     CONCAT44(fVar211 * auVar37._4_4_,
                                                              fVar210 * auVar37._0_4_)))),auVar73,
                         auVar81);
    auVar19._4_4_ = fVar211 * auVar66._4_4_;
    auVar19._0_4_ = fVar210 * auVar66._0_4_;
    auVar19._8_4_ = fVar212 * auVar66._8_4_;
    auVar19._12_4_ = fVar213 * auVar66._12_4_;
    auVar19._16_4_ = auVar66._16_4_ * 0.0;
    auVar19._20_4_ = auVar66._20_4_ * 0.0;
    auVar19._24_4_ = auVar66._24_4_ * 0.0;
    auVar19._28_4_ = auVar83._28_4_;
    auVar20._4_4_ = fVar211 * auVar81._4_4_;
    auVar20._0_4_ = fVar210 * auVar81._0_4_;
    auVar20._8_4_ = fVar212 * auVar81._8_4_;
    auVar20._12_4_ = fVar213 * auVar81._12_4_;
    auVar20._16_4_ = auVar81._16_4_ * 0.0;
    auVar20._20_4_ = auVar81._20_4_ * 0.0;
    auVar20._24_4_ = auVar81._24_4_ * 0.0;
    auVar20._28_4_ = auVar82._28_4_;
    auVar82 = vfmadd231ps_avx512vl(auVar19,auVar73,auVar65);
    auVar83 = vfmadd231ps_avx512vl(auVar20,auVar77,auVar73);
    auVar65 = vsubps_avx512vl(auVar66,auVar65);
    auVar66 = vsubps_avx512vl(auVar81,auVar77);
    auVar65 = vmulps_avx512vl(auVar65,auVar74);
    auVar66 = vmulps_avx512vl(auVar66,auVar74);
    fVar199 = fVar214 * auVar65._0_4_;
    fVar210 = fVar214 * auVar65._4_4_;
    auVar21._4_4_ = fVar210;
    auVar21._0_4_ = fVar199;
    fVar211 = fVar214 * auVar65._8_4_;
    auVar21._8_4_ = fVar211;
    fVar212 = fVar214 * auVar65._12_4_;
    auVar21._12_4_ = fVar212;
    fVar213 = fVar214 * auVar65._16_4_;
    auVar21._16_4_ = fVar213;
    fVar216 = fVar214 * auVar65._20_4_;
    auVar21._20_4_ = fVar216;
    fVar214 = fVar214 * auVar65._24_4_;
    auVar21._24_4_ = fVar214;
    auVar21._28_4_ = auVar65._28_4_;
    auVar66 = vmulps_avx512vl(auVar197,auVar66);
    auVar81 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar84);
    auVar73 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar84);
    auVar198._0_4_ = auVar82._0_4_ + fVar199;
    auVar198._4_4_ = auVar82._4_4_ + fVar210;
    auVar198._8_4_ = auVar82._8_4_ + fVar211;
    auVar198._12_4_ = auVar82._12_4_ + fVar212;
    auVar198._16_4_ = auVar82._16_4_ + fVar213;
    auVar198._20_4_ = auVar82._20_4_ + fVar216;
    auVar198._24_4_ = auVar82._24_4_ + fVar214;
    auVar198._28_4_ = auVar82._28_4_ + auVar65._28_4_;
    auVar65 = vpermt2ps_avx512vl(auVar21,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar74 = vaddps_avx512vl(auVar83,auVar66);
    auVar66 = vpermt2ps_avx512vl(auVar66,_DAT_0205fd20,ZEXT1632(auVar39));
    auVar65 = vsubps_avx(auVar81,auVar65);
    auVar66 = vsubps_avx512vl(auVar73,auVar66);
    auVar138 = ZEXT1632(auVar53);
    auVar77 = vsubps_avx512vl(auVar82,auVar138);
    auVar145 = ZEXT1632(auVar50);
    auVar61 = vsubps_avx512vl(auVar83,auVar145);
    auVar62 = vsubps_avx512vl(auVar81,auVar75);
    auVar77 = vaddps_avx512vl(auVar77,auVar62);
    auVar62 = vsubps_avx512vl(auVar73,auVar76);
    auVar61 = vaddps_avx512vl(auVar61,auVar62);
    auVar62 = vmulps_avx512vl(auVar145,auVar77);
    auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar138,auVar61);
    auVar78 = vmulps_avx512vl(auVar63,auVar77);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar116,auVar61);
    auVar79 = vmulps_avx512vl(auVar64,auVar77);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar67,auVar61);
    auVar80 = vmulps_avx512vl(auVar76,auVar77);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar75,auVar61);
    auVar84 = vmulps_avx512vl(auVar83,auVar77);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar82,auVar61);
    auVar85 = vmulps_avx512vl(auVar74,auVar77);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar198,auVar61);
    auVar86 = vmulps_avx512vl(auVar66,auVar77);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar65,auVar61);
    auVar77 = vmulps_avx512vl(auVar73,auVar77);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar81,auVar61);
    auVar61 = vminps_avx512vl(auVar62,auVar78);
    auVar62 = vmaxps_avx512vl(auVar62,auVar78);
    auVar78 = vminps_avx512vl(auVar79,auVar80);
    auVar61 = vminps_avx512vl(auVar61,auVar78);
    auVar78 = vmaxps_avx512vl(auVar79,auVar80);
    auVar62 = vmaxps_avx512vl(auVar62,auVar78);
    auVar78 = vminps_avx512vl(auVar84,auVar85);
    auVar79 = vmaxps_avx512vl(auVar84,auVar85);
    auVar80 = vminps_avx512vl(auVar86,auVar77);
    auVar78 = vminps_avx512vl(auVar78,auVar80);
    auVar61 = vminps_avx512vl(auVar61,auVar78);
    auVar77 = vmaxps_avx512vl(auVar86,auVar77);
    auVar77 = vmaxps_avx512vl(auVar79,auVar77);
    auVar77 = vmaxps_avx512vl(auVar62,auVar77);
    uVar10 = vcmpps_avx512vl(auVar61,local_1c0,2);
    uVar12 = vcmpps_avx512vl(auVar77,local_1e0,5);
    uVar28 = 0;
    bVar24 = (byte)uVar10 & (byte)uVar12 & 0x7f;
    if (bVar24 != 0) {
      auVar77 = vsubps_avx512vl(auVar75,auVar138);
      auVar61 = vsubps_avx512vl(auVar76,auVar145);
      auVar62 = vsubps_avx512vl(auVar81,auVar82);
      auVar77 = vaddps_avx512vl(auVar77,auVar62);
      auVar62 = vsubps_avx512vl(auVar73,auVar83);
      auVar61 = vaddps_avx512vl(auVar61,auVar62);
      auVar62 = vmulps_avx512vl(auVar145,auVar77);
      auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar61,auVar138);
      auVar63 = vmulps_avx512vl(auVar63,auVar77);
      auVar63 = vfnmadd213ps_avx512vl(auVar116,auVar61,auVar63);
      auVar64 = vmulps_avx512vl(auVar64,auVar77);
      auVar64 = vfnmadd213ps_avx512vl(auVar67,auVar61,auVar64);
      auVar67 = vmulps_avx512vl(auVar76,auVar77);
      auVar75 = vfnmadd231ps_avx512vl(auVar67,auVar61,auVar75);
      auVar67 = vmulps_avx512vl(auVar83,auVar77);
      auVar82 = vfnmadd231ps_avx512vl(auVar67,auVar61,auVar82);
      auVar67 = vmulps_avx512vl(auVar74,auVar77);
      auVar83 = vfnmadd213ps_avx512vl(auVar198,auVar61,auVar67);
      auVar67 = vmulps_avx512vl(auVar66,auVar77);
      auVar74 = vfnmadd213ps_avx512vl(auVar65,auVar61,auVar67);
      auVar67 = vmulps_avx512vl(auVar73,auVar77);
      auVar73 = vfnmadd231ps_avx512vl(auVar67,auVar81,auVar61);
      auVar65 = vminps_avx(auVar62,auVar63);
      auVar67 = vmaxps_avx(auVar62,auVar63);
      auVar66 = vminps_avx(auVar64,auVar75);
      auVar66 = vminps_avx(auVar65,auVar66);
      auVar65 = vmaxps_avx(auVar64,auVar75);
      auVar67 = vmaxps_avx(auVar67,auVar65);
      auVar81 = vminps_avx(auVar82,auVar83);
      auVar65 = vmaxps_avx(auVar82,auVar83);
      auVar82 = vminps_avx(auVar74,auVar73);
      auVar81 = vminps_avx(auVar81,auVar82);
      auVar81 = vminps_avx(auVar66,auVar81);
      auVar66 = vmaxps_avx(auVar74,auVar73);
      auVar65 = vmaxps_avx(auVar65,auVar66);
      auVar67 = vmaxps_avx(auVar67,auVar65);
      uVar10 = vcmpps_avx512vl(auVar67,local_1e0,5);
      uVar12 = vcmpps_avx512vl(auVar81,local_1c0,2);
      uVar28 = (uint)(bVar24 & (byte)uVar10 & (byte)uVar12);
    }
    if (uVar28 != 0) {
      auStack_420[uVar26] = uVar28;
      uVar10 = vmovlps_avx(auVar36);
      *(undefined8 *)(&uStack_280 + uVar26 * 2) = uVar10;
      uVar31 = vmovlps_avx512f(auVar52);
      auStack_1a0[uVar26] = uVar31;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar250 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar251 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar252 = ZEXT1664(auVar36);
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar253 = ZEXT3264(auVar67);
    auVar254 = ZEXT464(0x3f800000);
    auVar87._16_16_ = auVar67._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar255 = ZEXT1664(auVar36);
    auVar68 = auVar87;
    do {
      auVar38 = auVar258._0_16_;
      auVar36 = auVar255._0_16_;
      if ((int)uVar26 == 0) {
        if (bVar34) {
          return local_5a1;
        }
        uVar107 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar14._4_4_ = uVar107;
        auVar14._0_4_ = uVar107;
        auVar14._8_4_ = uVar107;
        auVar14._12_4_ = uVar107;
        auVar14._16_4_ = uVar107;
        auVar14._20_4_ = uVar107;
        auVar14._24_4_ = uVar107;
        auVar14._28_4_ = uVar107;
        uVar10 = vcmpps_avx512vl(local_200,auVar14,2);
        uVar32 = (uint)uVar33 & (uint)uVar10;
        uVar33 = (ulong)uVar32;
        local_5a1 = uVar32 != 0;
        if (!local_5a1) {
          return local_5a1;
        }
        goto LAB_01d68563;
      }
      uVar25 = (int)uVar26 - 1;
      uVar27 = (ulong)uVar25;
      uVar28 = (&uStack_280)[uVar27 * 2];
      fVar214 = afStack_27c[uVar27 * 2];
      uVar5 = auStack_420[uVar27];
      auVar247._8_8_ = 0;
      auVar247._0_8_ = auStack_1a0[uVar27];
      auVar249 = ZEXT1664(auVar247);
      lVar30 = 0;
      for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar29 = uVar5 - 1 & uVar5;
      auStack_420[uVar27] = uVar29;
      if (uVar29 == 0) {
        uVar26 = (ulong)uVar25;
      }
      auVar119._0_4_ = (float)lVar30;
      auVar119._4_8_ = SUB128(ZEXT812(0),4);
      auVar119._12_4_ = 0;
      auVar49 = vmulss_avx512f(auVar119,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar132._0_4_ = (float)lVar30;
      auVar132._4_8_ = SUB128(ZEXT812(0),4);
      auVar132._12_4_ = 0;
      auVar37 = vmulss_avx512f(auVar132,SUB6416(ZEXT464(0x3e124925),0));
      auVar48 = auVar254._0_16_;
      auVar39 = vsubss_avx512f(auVar48,auVar49);
      auVar49 = vmulss_avx512f(ZEXT416((uint)fVar214),auVar49);
      auVar101._0_16_ = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar28),auVar39);
      auVar49 = vsubss_avx512f(auVar48,auVar37);
      auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar37._0_4_)),ZEXT416(uVar28),auVar49);
      auVar37 = vsubss_avx512f(auVar49,auVar101._0_16_);
      vucomiss_avx512f(auVar37);
      if (uVar5 == 0 || lVar30 == 0) break;
      auVar39 = vshufps_avx(auVar247,auVar247,0x50);
      vucomiss_avx512f(auVar37);
      auVar50 = vsubps_avx512vl(auVar36,auVar39);
      fVar214 = auVar39._0_4_;
      auVar133._0_4_ = fVar226 * fVar214;
      fVar199 = auVar39._4_4_;
      auVar133._4_4_ = fVar227 * fVar199;
      fVar210 = auVar39._8_4_;
      auVar133._8_4_ = fVar226 * fVar210;
      fVar211 = auVar39._12_4_;
      auVar133._12_4_ = fVar227 * fVar211;
      auVar142._0_4_ = fVar105 * fVar214;
      auVar142._4_4_ = fVar106 * fVar199;
      auVar142._8_4_ = fVar105 * fVar210;
      auVar142._12_4_ = fVar106 * fVar211;
      auVar150._0_4_ = fVar129 * fVar214;
      auVar150._4_4_ = fVar148 * fVar199;
      auVar150._8_4_ = fVar129 * fVar210;
      auVar150._12_4_ = fVar148 * fVar211;
      auVar110._0_4_ = fVar224 * fVar214;
      auVar110._4_4_ = fVar225 * fVar199;
      auVar110._8_4_ = fVar224 * fVar210;
      auVar110._12_4_ = fVar225 * fVar211;
      auVar39 = vfmadd231ps_fma(auVar133,auVar50,auVar168);
      auVar53 = vfmadd231ps_fma(auVar142,auVar50,auVar47);
      auVar51 = vfmadd231ps_avx512vl(auVar150,auVar50,auVar108);
      auVar50 = vfmadd231ps_fma(auVar110,auVar118,auVar50);
      auVar128._16_16_ = auVar39;
      auVar128._0_16_ = auVar39;
      auVar139._16_16_ = auVar53;
      auVar139._0_16_ = auVar53;
      auVar146._16_16_ = auVar51;
      auVar146._0_16_ = auVar51;
      auVar162._0_4_ = auVar101._0_4_;
      auVar162._4_4_ = auVar162._0_4_;
      auVar162._8_4_ = auVar162._0_4_;
      auVar162._12_4_ = auVar162._0_4_;
      uVar107 = auVar49._0_4_;
      auVar162._20_4_ = uVar107;
      auVar162._16_4_ = uVar107;
      auVar162._24_4_ = uVar107;
      auVar162._28_4_ = uVar107;
      auVar67 = vsubps_avx(auVar139,auVar128);
      auVar53 = vfmadd213ps_fma(auVar67,auVar162,auVar128);
      auVar67 = vsubps_avx(auVar146,auVar139);
      auVar52 = vfmadd213ps_fma(auVar67,auVar162,auVar139);
      auVar39 = vsubps_avx(auVar50,auVar51);
      auVar140._16_16_ = auVar39;
      auVar140._0_16_ = auVar39;
      auVar39 = vfmadd213ps_fma(auVar140,auVar162,auVar146);
      auVar67 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar53));
      auVar53 = vfmadd213ps_fma(auVar67,auVar162,ZEXT1632(auVar53));
      auVar67 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar52));
      auVar39 = vfmadd213ps_fma(auVar67,auVar162,ZEXT1632(auVar52));
      auVar67 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar53));
      auVar163 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar67,auVar162);
      auVar67 = vmulps_avx512vl(auVar67,auVar253._0_32_);
      auVar164 = auVar67._16_16_;
      fVar214 = auVar37._0_4_ * 0.33333334;
      auVar151._0_8_ =
           CONCAT44(auVar163._4_4_ + fVar214 * auVar67._4_4_,
                    auVar163._0_4_ + fVar214 * auVar67._0_4_);
      auVar151._8_4_ = auVar163._8_4_ + fVar214 * auVar67._8_4_;
      auVar151._12_4_ = auVar163._12_4_ + fVar214 * auVar67._12_4_;
      auVar134._0_4_ = fVar214 * auVar67._16_4_;
      auVar134._4_4_ = fVar214 * auVar67._20_4_;
      auVar134._8_4_ = fVar214 * auVar67._24_4_;
      auVar134._12_4_ = fVar214 * auVar67._28_4_;
      auVar156 = vsubps_avx((undefined1  [16])0x0,auVar134);
      auVar59 = vshufpd_avx(auVar163,auVar163,3);
      auVar57 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar39 = vsubps_avx(auVar59,auVar163);
      auVar53 = vsubps_avx(auVar57,(undefined1  [16])0x0);
      auVar169._0_4_ = auVar53._0_4_ + auVar39._0_4_;
      auVar169._4_4_ = auVar53._4_4_ + auVar39._4_4_;
      auVar169._8_4_ = auVar53._8_4_ + auVar39._8_4_;
      auVar169._12_4_ = auVar53._12_4_ + auVar39._12_4_;
      auVar39 = vshufps_avx(auVar163,auVar163,0xb1);
      auVar53 = vshufps_avx(auVar151,auVar151,0xb1);
      auVar50 = vshufps_avx(auVar156,auVar156,0xb1);
      auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar229._4_4_ = auVar169._0_4_;
      auVar229._0_4_ = auVar169._0_4_;
      auVar229._8_4_ = auVar169._0_4_;
      auVar229._12_4_ = auVar169._0_4_;
      auVar51 = vshufps_avx(auVar169,auVar169,0x55);
      fVar214 = auVar51._0_4_;
      auVar182._0_4_ = auVar39._0_4_ * fVar214;
      fVar199 = auVar51._4_4_;
      auVar182._4_4_ = auVar39._4_4_ * fVar199;
      fVar210 = auVar51._8_4_;
      auVar182._8_4_ = auVar39._8_4_ * fVar210;
      fVar211 = auVar51._12_4_;
      auVar182._12_4_ = auVar39._12_4_ * fVar211;
      auVar193._0_4_ = auVar53._0_4_ * fVar214;
      auVar193._4_4_ = auVar53._4_4_ * fVar199;
      auVar193._8_4_ = auVar53._8_4_ * fVar210;
      auVar193._12_4_ = auVar53._12_4_ * fVar211;
      auVar202._0_4_ = auVar50._0_4_ * fVar214;
      auVar202._4_4_ = auVar50._4_4_ * fVar199;
      auVar202._8_4_ = auVar50._8_4_ * fVar210;
      auVar202._12_4_ = auVar50._12_4_ * fVar211;
      auVar170._0_4_ = auVar52._0_4_ * fVar214;
      auVar170._4_4_ = auVar52._4_4_ * fVar199;
      auVar170._8_4_ = auVar52._8_4_ * fVar210;
      auVar170._12_4_ = auVar52._12_4_ * fVar211;
      auVar39 = vfmadd231ps_fma(auVar182,auVar229,auVar163);
      auVar53 = vfmadd231ps_fma(auVar193,auVar229,auVar151);
      auVar51 = vfmadd231ps_fma(auVar202,auVar229,auVar156);
      auVar157 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar229);
      auVar58 = vshufpd_avx(auVar39,auVar39,1);
      auVar54 = vshufpd_avx(auVar53,auVar53,1);
      auVar55 = vshufpd_avx(auVar51,auVar51,1);
      auVar56 = vshufpd_avx(auVar157,auVar157,1);
      auVar50 = vminss_avx(auVar39,auVar53);
      auVar39 = vmaxss_avx(auVar53,auVar39);
      auVar52 = vminss_avx(auVar51,auVar157);
      auVar53 = vmaxss_avx(auVar157,auVar51);
      auVar52 = vminss_avx(auVar50,auVar52);
      auVar39 = vmaxss_avx(auVar53,auVar39);
      auVar51 = vminss_avx(auVar58,auVar54);
      auVar53 = vmaxss_avx(auVar54,auVar58);
      auVar58 = vminss_avx(auVar55,auVar56);
      auVar50 = vmaxss_avx(auVar56,auVar55);
      auVar51 = vminss_avx(auVar51,auVar58);
      auVar53 = vmaxss_avx(auVar50,auVar53);
      fVar210 = auVar52._0_4_;
      fVar199 = auVar53._0_4_;
      fVar214 = auVar39._0_4_;
      if ((0.0001 <= fVar210) || (fVar199 <= -0.0001)) {
        uVar10 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar12 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar214 & ((byte)uVar12 | (byte)uVar10)) != 0) goto LAB_01d694ca;
        uVar10 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar53,5);
        uVar12 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar12 | (ushort)uVar10) & 1) == 0) goto LAB_01d694ca;
        bVar11 = true;
        auVar249 = ZEXT1664(auVar247);
        auVar101._16_16_ = auVar164;
        auVar68 = auVar101;
      }
      else {
LAB_01d694ca:
        auVar54 = auVar257._0_16_;
        uVar10 = vcmpss_avx512f(auVar52,auVar54,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        iVar102 = auVar254._0_4_;
        fVar211 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar102);
        uVar10 = vcmpss_avx512f(auVar39,auVar54,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar212 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar102);
        bVar11 = fVar211 != fVar212;
        iVar256 = auVar257._0_4_;
        auVar89._16_16_ = auVar164;
        auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar11 * iVar256 + (uint)!bVar11 * 0x7f800000;
        auVar58 = auVar88._0_16_;
        auVar91._16_16_ = auVar164;
        auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar11 * iVar256 + (uint)!bVar11 * -0x800000;
        auVar50 = auVar90._0_16_;
        uVar10 = vcmpss_avx512f(auVar51,auVar54,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar213 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar102);
        if ((fVar211 != fVar213) || (NAN(fVar211) || NAN(fVar213))) {
          fVar211 = auVar51._0_4_;
          bVar11 = fVar211 == fVar210;
          if ((!bVar11) || (NAN(fVar211) || NAN(fVar210))) {
            auVar52 = vxorps_avx512vl(auVar52,auVar252._0_16_);
            auVar241._0_4_ = auVar52._0_4_ / (fVar211 - fVar210);
            auVar241._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar48,auVar241);
            auVar51 = vfmadd213ss_avx512f(auVar52,auVar54,auVar241);
            auVar52 = auVar51;
          }
          else {
            vucomiss_avx512f(auVar54);
            auVar93._16_16_ = auVar164;
            auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (uint)bVar11 * iVar256 + (uint)!bVar11 * 0x7f800000;
            auVar51 = auVar92._0_16_;
            auVar52 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar58 = vminss_avx(auVar58,auVar51);
          auVar50 = vmaxss_avx(auVar52,auVar50);
        }
        auVar249 = ZEXT1664(auVar247);
        uVar10 = vcmpss_avx512f(auVar53,auVar54,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar210 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar102);
        if ((fVar212 != fVar210) || (NAN(fVar212) || NAN(fVar210))) {
          bVar11 = fVar199 == fVar214;
          if ((!bVar11) || (NAN(fVar199) || NAN(fVar214))) {
            auVar39 = vxorps_avx512vl(auVar39,auVar252._0_16_);
            auVar203._0_4_ = auVar39._0_4_ / (fVar199 - fVar214);
            auVar203._4_12_ = auVar39._4_12_;
            auVar39 = vsubss_avx512f(auVar48,auVar203);
            auVar53 = vfmadd213ss_avx512f(auVar39,auVar54,auVar203);
            auVar39 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar54);
            auVar95._16_16_ = auVar164;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar11 * iVar256 + (uint)!bVar11 * 0x7f800000;
            auVar53 = auVar94._0_16_;
            auVar39 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar58 = vminss_avx(auVar58,auVar53);
          auVar50 = vmaxss_avx(auVar39,auVar50);
        }
        bVar11 = fVar213 != fVar210;
        auVar39 = vminss_avx512f(auVar58,auVar48);
        auVar97._16_16_ = auVar164;
        auVar97._0_16_ = auVar58;
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (uint)bVar11 * auVar39._0_4_ + (uint)!bVar11 * auVar58._0_4_;
        auVar39 = vmaxss_avx512f(auVar48,auVar50);
        auVar99._16_16_ = auVar164;
        auVar99._0_16_ = auVar50;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar11 * auVar39._0_4_ + (uint)!bVar11 * auVar50._0_4_;
        auVar39 = vmaxss_avx512f(auVar54,auVar96._0_16_);
        auVar53 = vminss_avx512f(auVar98._0_16_,auVar48);
        bVar11 = true;
        if (auVar39._0_4_ <= auVar53._0_4_) {
          auVar54 = vmaxss_avx512f(auVar54,ZEXT416((uint)(auVar39._0_4_ + -0.1)));
          auVar55 = vminss_avx512f(ZEXT416((uint)(auVar53._0_4_ + 0.1)),auVar48);
          auVar111._0_8_ = auVar163._0_8_;
          auVar111._8_8_ = auVar111._0_8_;
          auVar194._8_8_ = auVar151._0_8_;
          auVar194._0_8_ = auVar151._0_8_;
          auVar204._8_8_ = auVar156._0_8_;
          auVar204._0_8_ = auVar156._0_8_;
          auVar39 = vshufpd_avx(auVar151,auVar151,3);
          auVar53 = vshufpd_avx(auVar156,auVar156,3);
          auVar50 = vshufps_avx(auVar54,auVar55,0);
          auVar56 = vsubps_avx512vl(auVar36,auVar50);
          fVar214 = auVar50._0_4_;
          auVar237._0_4_ = fVar214 * auVar59._0_4_;
          fVar199 = auVar50._4_4_;
          auVar237._4_4_ = fVar199 * auVar59._4_4_;
          fVar210 = auVar50._8_4_;
          auVar237._8_4_ = fVar210 * auVar59._8_4_;
          fVar211 = auVar50._12_4_;
          auVar237._12_4_ = fVar211 * auVar59._12_4_;
          auVar152._0_4_ = fVar214 * auVar39._0_4_;
          auVar152._4_4_ = fVar199 * auVar39._4_4_;
          auVar152._8_4_ = fVar210 * auVar39._8_4_;
          auVar152._12_4_ = fVar211 * auVar39._12_4_;
          auVar158._0_4_ = fVar214 * auVar53._0_4_;
          auVar158._4_4_ = fVar199 * auVar53._4_4_;
          auVar158._8_4_ = fVar210 * auVar53._8_4_;
          auVar158._12_4_ = fVar211 * auVar53._12_4_;
          auVar135._0_4_ = fVar214 * auVar57._0_4_;
          auVar135._4_4_ = fVar199 * auVar57._4_4_;
          auVar135._8_4_ = fVar210 * auVar57._8_4_;
          auVar135._12_4_ = fVar211 * auVar57._12_4_;
          auVar52 = vfmadd231ps_fma(auVar237,auVar56,auVar111);
          auVar51 = vfmadd231ps_fma(auVar152,auVar56,auVar194);
          auVar58 = vfmadd231ps_fma(auVar158,auVar56,auVar204);
          auVar59 = vfmadd231ps_fma(auVar135,auVar56,ZEXT816(0));
          auVar53 = vsubss_avx512f(auVar48,auVar54);
          auVar39 = vmovshdup_avx(auVar247);
          auVar157 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * auVar54._0_4_)),auVar247,auVar53
                                    );
          auVar53 = vsubss_avx512f(auVar48,auVar55);
          auVar163 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * auVar39._0_4_)),auVar247,auVar53
                                    );
          auVar57 = vdivss_avx512f(auVar48,auVar37);
          auVar37 = vsubps_avx(auVar51,auVar52);
          auVar120._0_4_ = auVar37._0_4_ * 3.0;
          auVar120._4_4_ = auVar37._4_4_ * 3.0;
          auVar120._8_4_ = auVar37._8_4_ * 3.0;
          auVar120._12_4_ = auVar37._12_4_ * 3.0;
          auVar37 = vsubps_avx(auVar58,auVar51);
          auVar171._0_4_ = auVar37._0_4_ * 3.0;
          auVar171._4_4_ = auVar37._4_4_ * 3.0;
          auVar171._8_4_ = auVar37._8_4_ * 3.0;
          auVar171._12_4_ = auVar37._12_4_ * 3.0;
          auVar37 = vsubps_avx(auVar59,auVar58);
          auVar183._0_4_ = auVar37._0_4_ * 3.0;
          auVar183._4_4_ = auVar37._4_4_ * 3.0;
          auVar183._8_4_ = auVar37._8_4_ * 3.0;
          auVar183._12_4_ = auVar37._12_4_ * 3.0;
          auVar39 = vminps_avx(auVar171,auVar183);
          auVar37 = vmaxps_avx(auVar171,auVar183);
          auVar39 = vminps_avx(auVar120,auVar39);
          auVar37 = vmaxps_avx(auVar120,auVar37);
          auVar53 = vshufpd_avx(auVar39,auVar39,3);
          auVar50 = vshufpd_avx(auVar37,auVar37,3);
          auVar39 = vminps_avx(auVar39,auVar53);
          auVar37 = vmaxps_avx(auVar37,auVar50);
          fVar214 = auVar57._0_4_;
          auVar184._0_4_ = fVar214 * auVar39._0_4_;
          auVar184._4_4_ = fVar214 * auVar39._4_4_;
          auVar184._8_4_ = fVar214 * auVar39._8_4_;
          auVar184._12_4_ = fVar214 * auVar39._12_4_;
          auVar172._0_4_ = fVar214 * auVar37._0_4_;
          auVar172._4_4_ = fVar214 * auVar37._4_4_;
          auVar172._8_4_ = fVar214 * auVar37._8_4_;
          auVar172._12_4_ = fVar214 * auVar37._12_4_;
          auVar57 = vdivss_avx512f(auVar48,ZEXT416((uint)(auVar163._0_4_ - auVar157._0_4_)));
          auVar37 = vshufpd_avx(auVar52,auVar52,3);
          auVar39 = vshufpd_avx(auVar51,auVar51,3);
          auVar53 = vshufpd_avx(auVar58,auVar58,3);
          auVar50 = vshufpd_avx(auVar59,auVar59,3);
          auVar37 = vsubps_avx(auVar37,auVar52);
          auVar52 = vsubps_avx(auVar39,auVar51);
          auVar51 = vsubps_avx(auVar53,auVar58);
          auVar50 = vsubps_avx(auVar50,auVar59);
          auVar39 = vminps_avx(auVar37,auVar52);
          auVar37 = vmaxps_avx(auVar37,auVar52);
          auVar53 = vminps_avx(auVar51,auVar50);
          auVar53 = vminps_avx(auVar39,auVar53);
          auVar39 = vmaxps_avx(auVar51,auVar50);
          auVar37 = vmaxps_avx(auVar37,auVar39);
          fVar214 = auVar57._0_4_;
          auVar205._0_4_ = fVar214 * auVar53._0_4_;
          auVar205._4_4_ = fVar214 * auVar53._4_4_;
          auVar205._8_4_ = fVar214 * auVar53._8_4_;
          auVar205._12_4_ = fVar214 * auVar53._12_4_;
          auVar218._0_4_ = fVar214 * auVar37._0_4_;
          auVar218._4_4_ = fVar214 * auVar37._4_4_;
          auVar218._8_4_ = fVar214 * auVar37._8_4_;
          auVar218._12_4_ = fVar214 * auVar37._12_4_;
          auVar156 = vinsertps_avx512f(auVar101._0_16_,auVar157,0x10);
          auVar52 = vinsertps_avx(auVar49,auVar163,0x10);
          auVar104._0_4_ = auVar156._0_4_ + auVar52._0_4_;
          auVar104._4_4_ = auVar156._4_4_ + auVar52._4_4_;
          auVar104._8_4_ = auVar156._8_4_ + auVar52._8_4_;
          auVar104._12_4_ = auVar156._12_4_ + auVar52._12_4_;
          auVar55 = vmulps_avx512vl(auVar104,auVar250._0_16_);
          auVar53 = vshufps_avx(auVar55,auVar55,0x54);
          uVar107 = auVar55._0_4_;
          auVar121._4_4_ = uVar107;
          auVar121._0_4_ = uVar107;
          auVar121._8_4_ = uVar107;
          auVar121._12_4_ = uVar107;
          auVar51 = vfmadd213ps_avx512vl(auVar45,auVar121,auVar46);
          auVar39 = vfmadd213ps_fma(auVar44,auVar121,auVar43);
          auVar50 = vfmadd213ps_fma(auVar87._0_16_,auVar121,auVar42);
          auVar37 = vsubps_avx(auVar39,auVar51);
          auVar51 = vfmadd213ps_fma(auVar37,auVar121,auVar51);
          auVar37 = vsubps_avx(auVar50,auVar39);
          auVar37 = vfmadd213ps_fma(auVar37,auVar121,auVar39);
          auVar37 = vsubps_avx(auVar37,auVar51);
          auVar39 = vfmadd231ps_fma(auVar51,auVar37,auVar121);
          auVar122._0_8_ = CONCAT44(auVar37._4_4_ * 3.0,auVar37._0_4_ * 3.0);
          auVar122._8_4_ = auVar37._8_4_ * 3.0;
          auVar122._12_4_ = auVar37._12_4_ * 3.0;
          auVar230._8_8_ = auVar39._0_8_;
          auVar230._0_8_ = auVar39._0_8_;
          auVar37 = vshufpd_avx(auVar39,auVar39,3);
          auVar39 = vshufps_avx(auVar55,auVar55,0x55);
          auVar50 = vsubps_avx(auVar37,auVar230);
          auVar51 = vfmadd231ps_fma(auVar230,auVar39,auVar50);
          auVar242._8_8_ = auVar122._0_8_;
          auVar242._0_8_ = auVar122._0_8_;
          auVar37 = vshufpd_avx(auVar122,auVar122,3);
          auVar37 = vsubps_avx(auVar37,auVar242);
          auVar39 = vfmadd213ps_fma(auVar37,auVar39,auVar242);
          auVar123._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
          auVar123._8_4_ = auVar50._8_4_ ^ 0x80000000;
          auVar123._12_4_ = auVar50._12_4_ ^ 0x80000000;
          auVar37 = vmovshdup_avx(auVar39);
          auVar243._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
          auVar243._8_4_ = auVar37._8_4_ ^ 0x80000000;
          auVar243._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar58 = vmovshdup_avx512vl(auVar50);
          auVar59 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar50);
          auVar37 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar37._0_4_ * auVar50._0_4_)),auVar39,
                                        auVar58);
          auVar39 = vpermt2ps_avx512vl(auVar39,SUB6416(ZEXT464(4),0),auVar123);
          auVar136._0_4_ = auVar37._0_4_;
          auVar136._4_4_ = auVar136._0_4_;
          auVar136._8_4_ = auVar136._0_4_;
          auVar136._12_4_ = auVar136._0_4_;
          auVar37 = vdivps_avx(auVar59,auVar136);
          auVar39 = vdivps_avx(auVar39,auVar136);
          fVar199 = auVar51._0_4_;
          auVar50 = vshufps_avx(auVar51,auVar51,0x55);
          fVar214 = auVar39._0_4_;
          auVar231._0_4_ = fVar199 * auVar37._0_4_ + auVar50._0_4_ * fVar214;
          auVar231._4_4_ = fVar199 * auVar37._4_4_ + auVar50._4_4_ * auVar39._4_4_;
          auVar231._8_4_ = fVar199 * auVar37._8_4_ + auVar50._8_4_ * auVar39._8_4_;
          auVar231._12_4_ = fVar199 * auVar37._12_4_ + auVar50._12_4_ * auVar39._12_4_;
          auVar56 = vsubps_avx(auVar53,auVar231);
          auVar51 = vmovshdup_avx(auVar37);
          auVar53 = vinsertps_avx(auVar184,auVar205,0x1c);
          auVar244._0_4_ = auVar51._0_4_ * auVar53._0_4_;
          auVar244._4_4_ = auVar51._4_4_ * auVar53._4_4_;
          auVar244._8_4_ = auVar51._8_4_ * auVar53._8_4_;
          auVar244._12_4_ = auVar51._12_4_ * auVar53._12_4_;
          auVar50 = vinsertps_avx(auVar172,auVar218,0x1c);
          auVar232._0_4_ = auVar51._0_4_ * auVar50._0_4_;
          auVar232._4_4_ = auVar51._4_4_ * auVar50._4_4_;
          auVar232._8_4_ = auVar51._8_4_ * auVar50._8_4_;
          auVar232._12_4_ = auVar51._12_4_ * auVar50._12_4_;
          auVar54 = vminps_avx512vl(auVar244,auVar232);
          auVar59 = vmaxps_avx(auVar232,auVar244);
          auVar57 = vmovshdup_avx(auVar39);
          auVar51 = vinsertps_avx(auVar205,auVar184,0x4c);
          auVar206._0_4_ = auVar57._0_4_ * auVar51._0_4_;
          auVar206._4_4_ = auVar57._4_4_ * auVar51._4_4_;
          auVar206._8_4_ = auVar57._8_4_ * auVar51._8_4_;
          auVar206._12_4_ = auVar57._12_4_ * auVar51._12_4_;
          auVar58 = vinsertps_avx(auVar218,auVar172,0x4c);
          auVar219._0_4_ = auVar57._0_4_ * auVar58._0_4_;
          auVar219._4_4_ = auVar57._4_4_ * auVar58._4_4_;
          auVar219._8_4_ = auVar57._8_4_ * auVar58._8_4_;
          auVar219._12_4_ = auVar57._12_4_ * auVar58._12_4_;
          auVar57 = vminps_avx(auVar206,auVar219);
          auVar54 = vaddps_avx512vl(auVar54,auVar57);
          auVar57 = vmaxps_avx(auVar219,auVar206);
          auVar207._0_4_ = auVar59._0_4_ + auVar57._0_4_;
          auVar207._4_4_ = auVar59._4_4_ + auVar57._4_4_;
          auVar207._8_4_ = auVar59._8_4_ + auVar57._8_4_;
          auVar207._12_4_ = auVar59._12_4_ + auVar57._12_4_;
          auVar220._8_8_ = 0x3f80000000000000;
          auVar220._0_8_ = 0x3f80000000000000;
          auVar59 = vsubps_avx(auVar220,auVar207);
          auVar57 = vsubps_avx(auVar220,auVar54);
          auVar54 = vsubps_avx(auVar156,auVar55);
          auVar55 = vsubps_avx(auVar52,auVar55);
          fVar213 = auVar54._0_4_;
          auVar245._0_4_ = fVar213 * auVar59._0_4_;
          fVar216 = auVar54._4_4_;
          auVar245._4_4_ = fVar216 * auVar59._4_4_;
          fVar234 = auVar54._8_4_;
          auVar245._8_4_ = fVar234 * auVar59._8_4_;
          fVar235 = auVar54._12_4_;
          auVar245._12_4_ = fVar235 * auVar59._12_4_;
          auVar60 = vbroadcastss_avx512vl(auVar37);
          auVar53 = vmulps_avx512vl(auVar60,auVar53);
          auVar50 = vmulps_avx512vl(auVar60,auVar50);
          auVar60 = vminps_avx512vl(auVar53,auVar50);
          auVar53 = vmaxps_avx(auVar50,auVar53);
          auVar185._0_4_ = fVar214 * auVar51._0_4_;
          auVar185._4_4_ = fVar214 * auVar51._4_4_;
          auVar185._8_4_ = fVar214 * auVar51._8_4_;
          auVar185._12_4_ = fVar214 * auVar51._12_4_;
          auVar173._0_4_ = fVar214 * auVar58._0_4_;
          auVar173._4_4_ = fVar214 * auVar58._4_4_;
          auVar173._8_4_ = fVar214 * auVar58._8_4_;
          auVar173._12_4_ = fVar214 * auVar58._12_4_;
          auVar50 = vminps_avx(auVar185,auVar173);
          auVar51 = vaddps_avx512vl(auVar60,auVar50);
          auVar58 = vmulps_avx512vl(auVar54,auVar57);
          fVar199 = auVar55._0_4_;
          auVar208._0_4_ = fVar199 * auVar59._0_4_;
          fVar210 = auVar55._4_4_;
          auVar208._4_4_ = fVar210 * auVar59._4_4_;
          fVar211 = auVar55._8_4_;
          auVar208._8_4_ = fVar211 * auVar59._8_4_;
          fVar212 = auVar55._12_4_;
          auVar208._12_4_ = fVar212 * auVar59._12_4_;
          auVar221._0_4_ = fVar199 * auVar57._0_4_;
          auVar221._4_4_ = fVar210 * auVar57._4_4_;
          auVar221._8_4_ = fVar211 * auVar57._8_4_;
          auVar221._12_4_ = fVar212 * auVar57._12_4_;
          auVar50 = vmaxps_avx(auVar173,auVar185);
          auVar174._0_4_ = auVar53._0_4_ + auVar50._0_4_;
          auVar174._4_4_ = auVar53._4_4_ + auVar50._4_4_;
          auVar174._8_4_ = auVar53._8_4_ + auVar50._8_4_;
          auVar174._12_4_ = auVar53._12_4_ + auVar50._12_4_;
          auVar186._8_8_ = 0x3f800000;
          auVar186._0_8_ = 0x3f800000;
          auVar53 = vsubps_avx(auVar186,auVar174);
          auVar50 = vsubps_avx(auVar186,auVar51);
          auVar238._0_4_ = fVar213 * auVar53._0_4_;
          auVar238._4_4_ = fVar216 * auVar53._4_4_;
          auVar238._8_4_ = fVar234 * auVar53._8_4_;
          auVar238._12_4_ = fVar235 * auVar53._12_4_;
          auVar233._0_4_ = fVar213 * auVar50._0_4_;
          auVar233._4_4_ = fVar216 * auVar50._4_4_;
          auVar233._8_4_ = fVar234 * auVar50._8_4_;
          auVar233._12_4_ = fVar235 * auVar50._12_4_;
          auVar175._0_4_ = fVar199 * auVar53._0_4_;
          auVar175._4_4_ = fVar210 * auVar53._4_4_;
          auVar175._8_4_ = fVar211 * auVar53._8_4_;
          auVar175._12_4_ = fVar212 * auVar53._12_4_;
          auVar187._0_4_ = fVar199 * auVar50._0_4_;
          auVar187._4_4_ = fVar210 * auVar50._4_4_;
          auVar187._8_4_ = fVar211 * auVar50._8_4_;
          auVar187._12_4_ = fVar212 * auVar50._12_4_;
          auVar53 = vminps_avx(auVar238,auVar233);
          auVar50 = vminps_avx(auVar175,auVar187);
          auVar51 = vminps_avx(auVar53,auVar50);
          auVar53 = vmaxps_avx(auVar233,auVar238);
          auVar50 = vmaxps_avx(auVar187,auVar175);
          auVar50 = vmaxps_avx(auVar50,auVar53);
          auVar59 = vminps_avx512vl(auVar245,auVar58);
          auVar53 = vminps_avx(auVar208,auVar221);
          auVar53 = vminps_avx(auVar59,auVar53);
          auVar53 = vhaddps_avx(auVar51,auVar53);
          auVar58 = vmaxps_avx512vl(auVar58,auVar245);
          auVar51 = vmaxps_avx(auVar221,auVar208);
          auVar51 = vmaxps_avx(auVar51,auVar58);
          auVar50 = vhaddps_avx(auVar50,auVar51);
          auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
          auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
          auVar176._0_4_ = auVar53._0_4_ + auVar56._0_4_;
          auVar176._4_4_ = auVar53._4_4_ + auVar56._4_4_;
          auVar176._8_4_ = auVar53._8_4_ + auVar56._8_4_;
          auVar176._12_4_ = auVar53._12_4_ + auVar56._12_4_;
          auVar188._0_4_ = auVar50._0_4_ + auVar56._0_4_;
          auVar188._4_4_ = auVar50._4_4_ + auVar56._4_4_;
          auVar188._8_4_ = auVar50._8_4_ + auVar56._8_4_;
          auVar188._12_4_ = auVar50._12_4_ + auVar56._12_4_;
          auVar53 = vmaxps_avx(auVar156,auVar176);
          auVar50 = vminps_avx(auVar188,auVar52);
          uVar31 = vcmpps_avx512vl(auVar50,auVar53,1);
          auVar53 = vinsertps_avx(auVar157,auVar163,0x10);
          auVar249 = ZEXT1664(auVar53);
          auVar50 = ZEXT416(5);
          if ((uVar31 & 3) == 0) {
            vucomiss_avx512f(auVar101._0_16_);
            auVar100._0_16_ = vxorps_avx512vl(auVar50,auVar50);
            auVar100._16_16_ = auVar164;
            auVar257 = ZEXT1664(auVar100._0_16_);
            local_450 = auVar41._0_4_;
            fStack_44c = auVar41._4_4_;
            fStack_448 = auVar41._8_4_;
            fStack_444 = auVar41._12_4_;
            if ((uint)uVar26 < 4 && (uVar5 == 0 || lVar30 == 0)) {
              bVar11 = false;
              auVar68 = auVar100;
            }
            else {
              lVar30 = 200;
              auVar68 = auVar100;
              do {
                auVar50 = vsubss_avx512f(auVar48,auVar56);
                fVar211 = auVar50._0_4_;
                fVar199 = fVar211 * fVar211 * fVar211;
                fVar212 = auVar56._0_4_;
                fVar210 = fVar212 * 3.0 * fVar211 * fVar211;
                fVar211 = fVar211 * fVar212 * fVar212 * 3.0;
                auVar153._4_4_ = fVar199;
                auVar153._0_4_ = fVar199;
                auVar153._8_4_ = fVar199;
                auVar153._12_4_ = fVar199;
                auVar143._4_4_ = fVar210;
                auVar143._0_4_ = fVar210;
                auVar143._8_4_ = fVar210;
                auVar143._12_4_ = fVar210;
                auVar112._4_4_ = fVar211;
                auVar112._0_4_ = fVar211;
                auVar112._8_4_ = fVar211;
                auVar112._12_4_ = fVar211;
                fVar212 = fVar212 * fVar212 * fVar212;
                auVar159._0_4_ = local_450 * fVar212;
                auVar159._4_4_ = fStack_44c * fVar212;
                auVar159._8_4_ = fStack_448 * fVar212;
                auVar159._12_4_ = fStack_444 * fVar212;
                auVar50 = vfmadd231ps_fma(auVar159,auVar42,auVar112);
                auVar50 = vfmadd231ps_fma(auVar50,auVar43,auVar143);
                auVar50 = vfmadd231ps_fma(auVar50,auVar46,auVar153);
                auVar113._8_8_ = auVar50._0_8_;
                auVar113._0_8_ = auVar50._0_8_;
                auVar50 = vshufpd_avx(auVar50,auVar50,3);
                auVar52 = vshufps_avx(auVar56,auVar56,0x55);
                auVar50 = vsubps_avx(auVar50,auVar113);
                auVar52 = vfmadd213ps_fma(auVar50,auVar52,auVar113);
                fVar199 = auVar52._0_4_;
                auVar50 = vshufps_avx(auVar52,auVar52,0x55);
                auVar114._0_4_ = auVar37._0_4_ * fVar199 + fVar214 * auVar50._0_4_;
                auVar114._4_4_ = auVar37._4_4_ * fVar199 + auVar39._4_4_ * auVar50._4_4_;
                auVar114._8_4_ = auVar37._8_4_ * fVar199 + auVar39._8_4_ * auVar50._8_4_;
                auVar114._12_4_ = auVar37._12_4_ * fVar199 + auVar39._12_4_ * auVar50._12_4_;
                auVar56 = vsubps_avx(auVar56,auVar114);
                auVar50 = vandps_avx512vl(auVar52,auVar251._0_16_);
                auVar68._0_16_ = vprolq_avx512vl(auVar50,0x20);
                auVar50 = vmaxss_avx(auVar68._0_16_,auVar50);
                bVar35 = auVar50._0_4_ <= fVar103;
                if (auVar50._0_4_ < fVar103) {
                  auVar37 = vucomiss_avx512f(auVar100._0_16_);
                  if (bVar35) {
                    auVar39 = vucomiss_avx512f(auVar37);
                    auVar254 = ZEXT1664(auVar39);
                    if (bVar35) {
                      vmovshdup_avx(auVar37);
                      auVar39 = vucomiss_avx512f(auVar100._0_16_);
                      if (bVar35) {
                        auVar48 = vucomiss_avx512f(auVar39);
                        auVar254 = ZEXT1664(auVar48);
                        if (bVar35) {
                          auVar50 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar55 = vinsertps_avx(auVar50,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar50 = vdpps_avx(auVar55,local_290,0x7f);
                          auVar52 = vdpps_avx(auVar55,local_2a0,0x7f);
                          auVar51 = vdpps_avx(auVar55,local_2b0,0x7f);
                          auVar58 = vdpps_avx(auVar55,local_2c0,0x7f);
                          auVar59 = vdpps_avx(auVar55,local_2d0,0x7f);
                          auVar57 = vdpps_avx(auVar55,local_2e0,0x7f);
                          auVar54 = vdpps_avx(auVar55,local_2f0,0x7f);
                          auVar55 = vdpps_avx(auVar55,local_300,0x7f);
                          auVar56 = vsubss_avx512f(auVar48,auVar39);
                          fVar214 = auVar39._0_4_;
                          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar59._0_4_)),auVar56
                                                    ,auVar50);
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar214)),auVar56
                                                    ,auVar52);
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar214)),auVar56
                                                    ,auVar51);
                          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar55._0_4_)),auVar56
                                                    ,auVar58);
                          auVar68._0_16_ = vsubss_avx512f(auVar48,auVar37);
                          auVar160._0_4_ = auVar68._0_4_;
                          fVar214 = auVar160._0_4_ * auVar160._0_4_ * auVar160._0_4_;
                          local_120 = auVar37._0_4_;
                          fVar199 = local_120 * 3.0 * auVar160._0_4_ * auVar160._0_4_;
                          fVar210 = auVar160._0_4_ * local_120 * local_120 * 3.0;
                          fVar212 = local_120 * local_120 * local_120;
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar51._0_4_)),
                                                    ZEXT416((uint)fVar210),auVar52);
                          auVar48 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar199),auVar50);
                          auVar39 = vfmadd231ss_fma(auVar48,ZEXT416((uint)fVar214),auVar39);
                          fVar211 = auVar39._0_4_;
                          if ((fVar215 <= fVar211) &&
                             (fVar213 = *(float *)(ray + k * 4 + 0x100), fVar211 <= fVar213)) {
                            auVar39 = vshufps_avx(auVar37,auVar37,0x55);
                            auVar50 = vsubps_avx512vl(auVar36,auVar39);
                            fVar216 = auVar39._0_4_;
                            auVar195._0_4_ = fVar216 * (float)local_320._0_4_;
                            fVar234 = auVar39._4_4_;
                            auVar195._4_4_ = fVar234 * (float)local_320._4_4_;
                            fVar235 = auVar39._8_4_;
                            auVar195._8_4_ = fVar235 * fStack_318;
                            fVar236 = auVar39._12_4_;
                            auVar195._12_4_ = fVar236 * fStack_314;
                            auVar209._0_4_ = fVar216 * (float)local_370._0_4_;
                            auVar209._4_4_ = fVar234 * (float)local_370._4_4_;
                            auVar209._8_4_ = fVar235 * fStack_368;
                            auVar209._12_4_ = fVar236 * fStack_364;
                            auVar222._0_4_ = fVar216 * (float)local_380._0_4_;
                            auVar222._4_4_ = fVar234 * (float)local_380._4_4_;
                            auVar222._8_4_ = fVar235 * fStack_378;
                            auVar222._12_4_ = fVar236 * fStack_374;
                            auVar177._0_4_ = fVar216 * (float)local_340._0_4_;
                            auVar177._4_4_ = fVar234 * (float)local_340._4_4_;
                            auVar177._8_4_ = fVar235 * fStack_338;
                            auVar177._12_4_ = fVar236 * fStack_334;
                            auVar36 = vfmadd231ps_fma(auVar195,auVar50,local_310);
                            auVar39 = vfmadd231ps_fma(auVar209,auVar50,local_350);
                            auVar48 = vfmadd231ps_fma(auVar222,auVar50,local_360);
                            auVar50 = vfmadd231ps_fma(auVar177,auVar50,local_330);
                            auVar36 = vsubps_avx(auVar39,auVar36);
                            auVar39 = vsubps_avx(auVar48,auVar39);
                            auVar48 = vsubps_avx(auVar50,auVar48);
                            auVar223._0_4_ = local_120 * auVar39._0_4_;
                            auVar223._4_4_ = local_120 * auVar39._4_4_;
                            auVar223._8_4_ = local_120 * auVar39._8_4_;
                            auVar223._12_4_ = local_120 * auVar39._12_4_;
                            auVar160._4_4_ = auVar160._0_4_;
                            auVar160._8_4_ = auVar160._0_4_;
                            auVar160._12_4_ = auVar160._0_4_;
                            auVar36 = vfmadd231ps_fma(auVar223,auVar160,auVar36);
                            auVar178._0_4_ = local_120 * auVar48._0_4_;
                            auVar178._4_4_ = local_120 * auVar48._4_4_;
                            auVar178._8_4_ = local_120 * auVar48._8_4_;
                            auVar178._12_4_ = local_120 * auVar48._12_4_;
                            auVar39 = vfmadd231ps_fma(auVar178,auVar160,auVar39);
                            auVar179._0_4_ = local_120 * auVar39._0_4_;
                            auVar179._4_4_ = local_120 * auVar39._4_4_;
                            auVar179._8_4_ = local_120 * auVar39._8_4_;
                            auVar179._12_4_ = local_120 * auVar39._12_4_;
                            auVar36 = vfmadd231ps_fma(auVar179,auVar160,auVar36);
                            auVar13._8_4_ = 0x40400000;
                            auVar13._0_8_ = 0x4040000040400000;
                            auVar13._12_4_ = 0x40400000;
                            auVar68._0_16_ = vmulps_avx512vl(auVar36,auVar13);
                            pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar35 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar35 = true,
                                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar154._0_4_ = fVar212 * (float)local_3c0._0_4_;
                              auVar154._4_4_ = fVar212 * (float)local_3c0._4_4_;
                              auVar154._8_4_ = fVar212 * fStack_3b8;
                              auVar154._12_4_ = fVar212 * fStack_3b4;
                              auVar144._4_4_ = fVar210;
                              auVar144._0_4_ = fVar210;
                              auVar144._8_4_ = fVar210;
                              auVar144._12_4_ = fVar210;
                              auVar36 = vfmadd132ps_fma(auVar144,auVar154,local_3b0);
                              auVar137._4_4_ = fVar199;
                              auVar137._0_4_ = fVar199;
                              auVar137._8_4_ = fVar199;
                              auVar137._12_4_ = fVar199;
                              auVar36 = vfmadd132ps_fma(auVar137,auVar36,local_3a0);
                              auVar124._4_4_ = fVar214;
                              auVar124._0_4_ = fVar214;
                              auVar124._8_4_ = fVar214;
                              auVar124._12_4_ = fVar214;
                              auVar48 = vfmadd132ps_fma(auVar124,auVar36,local_390);
                              auVar36 = vshufps_avx(auVar48,auVar48,0xc9);
                              auVar39 = vshufps_avx(auVar68._0_16_,auVar68._0_16_,0xc9);
                              auVar125._0_4_ = auVar48._0_4_ * auVar39._0_4_;
                              auVar125._4_4_ = auVar48._4_4_ * auVar39._4_4_;
                              auVar125._8_4_ = auVar48._8_4_ * auVar39._8_4_;
                              auVar125._12_4_ = auVar48._12_4_ * auVar39._12_4_;
                              auVar36 = vfmsub231ps_fma(auVar125,auVar68._0_16_,auVar36);
                              auVar147._8_4_ = 1;
                              auVar147._0_8_ = 0x100000001;
                              auVar147._12_4_ = 1;
                              auVar147._16_4_ = 1;
                              auVar147._20_4_ = 1;
                              auVar147._24_4_ = 1;
                              auVar147._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar147,ZEXT1632(auVar37));
                              auVar67 = vpermps_avx2(auVar147,ZEXT1632(auVar36));
                              auVar155._8_4_ = 2;
                              auVar155._0_8_ = 0x200000002;
                              auVar155._12_4_ = 2;
                              auVar155._16_4_ = 2;
                              auVar155._20_4_ = 2;
                              auVar155._24_4_ = 2;
                              auVar155._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar155,ZEXT1632(auVar36));
                              local_140 = auVar36._0_4_;
                              local_180[0] = (RTCHitN)auVar67[0];
                              local_180[1] = (RTCHitN)auVar67[1];
                              local_180[2] = (RTCHitN)auVar67[2];
                              local_180[3] = (RTCHitN)auVar67[3];
                              local_180[4] = (RTCHitN)auVar67[4];
                              local_180[5] = (RTCHitN)auVar67[5];
                              local_180[6] = (RTCHitN)auVar67[6];
                              local_180[7] = (RTCHitN)auVar67[7];
                              local_180[8] = (RTCHitN)auVar67[8];
                              local_180[9] = (RTCHitN)auVar67[9];
                              local_180[10] = (RTCHitN)auVar67[10];
                              local_180[0xb] = (RTCHitN)auVar67[0xb];
                              local_180[0xc] = (RTCHitN)auVar67[0xc];
                              local_180[0xd] = (RTCHitN)auVar67[0xd];
                              local_180[0xe] = (RTCHitN)auVar67[0xe];
                              local_180[0xf] = (RTCHitN)auVar67[0xf];
                              local_180[0x10] = (RTCHitN)auVar67[0x10];
                              local_180[0x11] = (RTCHitN)auVar67[0x11];
                              local_180[0x12] = (RTCHitN)auVar67[0x12];
                              local_180[0x13] = (RTCHitN)auVar67[0x13];
                              local_180[0x14] = (RTCHitN)auVar67[0x14];
                              local_180[0x15] = (RTCHitN)auVar67[0x15];
                              local_180[0x16] = (RTCHitN)auVar67[0x16];
                              local_180[0x17] = (RTCHitN)auVar67[0x17];
                              local_180[0x18] = (RTCHitN)auVar67[0x18];
                              local_180[0x19] = (RTCHitN)auVar67[0x19];
                              local_180[0x1a] = (RTCHitN)auVar67[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar67[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar67[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar67[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar67[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar67[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_220._0_8_;
                              uStack_d8 = local_220._8_8_;
                              uStack_d0 = local_220._16_8_;
                              uStack_c8 = local_220._24_8_;
                              local_c0 = local_240;
                              vpcmpeqd_avx2(local_240,local_240);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar211;
                              local_3e0 = local_260._0_8_;
                              uStack_3d8 = local_260._8_8_;
                              uStack_3d0 = local_260._16_8_;
                              uStack_3c8 = local_260._24_8_;
                              local_410.valid = (int *)&local_3e0;
                              local_410.geometryUserPtr = pGVar6->userPtr;
                              local_410.context = context->user;
                              local_410.ray = (RTCRayN *)ray;
                              local_410.hit = local_180;
                              local_410.N = 8;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&local_410);
                                auVar36 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
                                auVar257 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar255 = ZEXT1664(auVar36);
                                auVar254 = ZEXT464(0x3f800000);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar253 = ZEXT3264(auVar67);
                                auVar68._16_16_ = auVar67._16_16_;
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar252 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar251 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar250 = ZEXT1664(auVar36);
                                auVar68._0_16_ = vxorps_avx512vl(auVar38,auVar38);
                                auVar258 = ZEXT1664(auVar68._0_16_);
                              }
                              auVar38 = auVar258._0_16_;
                              auVar36 = auVar257._0_16_;
                              auVar22._8_8_ = uStack_3d8;
                              auVar22._0_8_ = local_3e0;
                              auVar22._16_8_ = uStack_3d0;
                              auVar22._24_8_ = uStack_3c8;
                              if (auVar22 == (undefined1  [32])0x0) {
                                bVar35 = false;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&local_410);
                                  auVar36 = vxorps_avx512vl(auVar36,auVar36);
                                  auVar257 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar255 = ZEXT1664(auVar36);
                                  auVar254 = ZEXT464(0x3f800000);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar253 = ZEXT3264(auVar67);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar252 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar251 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar250 = ZEXT1664(auVar36);
                                  auVar36 = vxorps_avx512vl(auVar38,auVar38);
                                  auVar258 = ZEXT1664(auVar36);
                                }
                                auVar23._8_8_ = uStack_3d8;
                                auVar23._0_8_ = local_3e0;
                                auVar23._16_8_ = uStack_3d0;
                                auVar23._24_8_ = uStack_3c8;
                                uVar31 = vptestmd_avx512vl(auVar23,auVar23);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar35 = (bool)((byte)uVar31 & 1);
                                auVar68._0_4_ =
                                     (uint)bVar35 * auVar67._0_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x100);
                                bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
                                auVar68._4_4_ =
                                     (uint)bVar35 * auVar67._4_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x104);
                                bVar35 = (bool)((byte)(uVar31 >> 2) & 1);
                                auVar68._8_4_ =
                                     (uint)bVar35 * auVar67._8_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x108);
                                bVar35 = (bool)((byte)(uVar31 >> 3) & 1);
                                auVar68._12_4_ =
                                     (uint)bVar35 * auVar67._12_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x10c);
                                bVar35 = (bool)((byte)(uVar31 >> 4) & 1);
                                auVar68._16_4_ =
                                     (uint)bVar35 * auVar67._16_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x110);
                                bVar35 = (bool)((byte)(uVar31 >> 5) & 1);
                                auVar68._20_4_ =
                                     (uint)bVar35 * auVar67._20_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x114);
                                bVar35 = (bool)((byte)(uVar31 >> 6) & 1);
                                auVar68._24_4_ =
                                     (uint)bVar35 * auVar67._24_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x118);
                                bVar35 = SUB81(uVar31 >> 7,0);
                                auVar68._28_4_ =
                                     (uint)bVar35 * auVar67._28_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x11c);
                                *(undefined1 (*) [32])(local_410.ray + 0x100) = auVar68;
                                bVar35 = auVar23 != (undefined1  [32])0x0;
                              }
                              if (!bVar35) {
                                *(float *)(ray + k * 4 + 0x100) = fVar213;
                              }
                            }
                            auVar249 = ZEXT1664(auVar53);
                            bVar34 = (bool)(bVar34 | bVar35);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar30 = lVar30 + -1;
              } while (lVar30 != 0);
            }
          }
          else {
            auVar36 = vxorps_avx512vl(ZEXT416(5),auVar50);
            auVar257 = ZEXT1664(auVar36);
            auVar68._16_16_ = auVar164;
            auVar68._0_16_ = auVar108;
          }
        }
        else {
          auVar68._16_16_ = auVar164;
          auVar68._0_16_ = auVar108;
        }
      }
    } while (bVar11);
    auVar36 = vinsertps_avx512f(auVar101._0_16_,auVar49,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }